

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  char *pcVar1;
  uint *pk_parity;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  uchar *puVar5;
  secp256k1_callback *error_callback;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint32_t uVar9;
  int iVar10;
  ulong uVar11;
  FILE *__stream;
  size_t sVar12;
  secp256k1_ge *psVar13;
  secp256k1_context *psVar14;
  secp256k1_scratch *scratch;
  void *pvVar15;
  void *pvVar16;
  ulong extraout_RAX;
  undefined4 uVar17;
  uint uVar18;
  uint uVar19;
  void *pvVar20;
  ulong uVar21;
  secp256k1_fe *a;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  bool bVar22;
  uint uVar23;
  secp256k1_gej *psVar24;
  char *pcVar25;
  long lVar26;
  FILE *pFVar27;
  uint64_t uVar28;
  uint uVar29;
  undefined1 *puVar30;
  ulong uVar31;
  ulong uVar32;
  secp256k1_fe *a_00;
  secp256k1_gej *psVar33;
  _func_void_char_ptr_void_ptr *p_Var34;
  uint64_t *puVar35;
  ulong uVar36;
  secp256k1_context *r;
  secp256k1_ge *psVar37;
  ulong in_R8;
  code *na;
  uint64_t uVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  secp256k1_fe *psVar42;
  secp256k1_fe *psVar43;
  secp256k1_gej *psVar44;
  long lVar45;
  secp256k1_scalar *psVar46;
  uint uVar47;
  secp256k1_context *psVar48;
  undefined1 *puVar49;
  undefined1 *puVar50;
  secp256k1_scalar *r_00;
  secp256k1_keypair *keypair;
  uchar *puVar51;
  secp256k1_context *a_01;
  secp256k1_xonly_pubkey *psVar52;
  bool bVar53;
  byte bVar54;
  undefined1 auVar55 [16];
  secp256k1_fe s;
  secp256k1_fe u1;
  secp256k1_fe d;
  secp256k1_fe g;
  secp256k1_gej *psStack_1e68;
  secp256k1_gej *psStack_1e60;
  secp256k1_scalar *psStack_1e58;
  ulong uStack_1e48;
  secp256k1_scalar *psStack_1e40;
  int iStack_1e34;
  secp256k1_gej *psStack_1e30;
  size_t sStack_1e28;
  undefined1 auStack_1e20 [16];
  undefined1 auStack_1e10 [16];
  undefined1 auStack_1e00 [16];
  int iStack_1df0;
  undefined1 auStack_1de0 [16];
  undefined1 auStack_1dd0 [16];
  int iStack_1db4;
  undefined1 auStack_1db0 [48];
  _func_void_char_ptr_void_ptr *p_Stack_1d80;
  secp256k1_scalar *psStack_1d78;
  _func_void_char_ptr_void_ptr *p_Stack_1d70;
  secp256k1_callback *psStack_1d68;
  uint uStack_1d5c;
  ulong uStack_1d58;
  secp256k1_scratch *psStack_1d50;
  uint64_t uStack_1d48;
  secp256k1_callback sStack_1d40;
  secp256k1_callback sStack_1d30;
  uint64_t uStack_1d20;
  secp256k1_scalar *psStack_1d18;
  _func_void_char_ptr_void_ptr *p_Stack_1d10;
  secp256k1_gej *psStack_1d08;
  _func_void_char_ptr_void_ptr *p_Stack_1d00;
  undefined1 *puStack_1cf8;
  secp256k1_gej *psStack_1cf0;
  secp256k1_schnorrsig_extraparams sStack_1ce8;
  undefined1 auStack_1cd0 [16];
  undefined1 auStack_1cc0 [16];
  undefined1 auStack_1cb0 [16];
  undefined1 auStack_1ca0 [16];
  undefined1 auStack_1b70 [32];
  uchar auStack_1b50 [32];
  undefined1 auStack_1b30 [56];
  uchar auStack_1af8 [8];
  undefined1 auStack_1af0 [16];
  undefined4 uStack_1ae0;
  undefined4 uStack_1adc;
  int iStack_1ad8;
  int iStack_1ad4;
  int iStack_1ad0;
  uchar auStack_1850 [32];
  undefined1 auStack_1830 [16];
  undefined1 auStack_1820 [16];
  uchar auStack_1810 [4];
  uchar auStack_180c [4];
  int iStack_1808;
  int iStack_1804;
  undefined1 auStack_1590 [96];
  secp256k1_context asStack_1530 [5];
  undefined1 auStack_10b0 [32];
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  int iStack_1088;
  int iStack_1084;
  ulong uStack_1080;
  uint64_t auStack_1078 [2];
  uint64_t uStack_1068;
  uchar auStack_1060 [4];
  uchar auStack_105c [4];
  int aiStack_1058 [4];
  secp256k1_context asStack_1048 [5];
  secp256k1_ge sStack_bd0;
  undefined1 auStack_b68 [8];
  undefined1 auStack_b60 [152];
  secp256k1_context asStack_ac8 [9];
  secp256k1_gej *psStack_3a8;
  secp256k1_fe *psStack_3a0;
  secp256k1_gej *psStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  code *pcStack_380;
  secp256k1_gej *psStack_378;
  code *pcStack_368;
  secp256k1_gej *psStack_358;
  undefined1 auStack_350 [24];
  uint64_t uStack_338;
  uint64_t uStack_330;
  int iStack_328;
  int iStack_324;
  secp256k1_fe sStack_320;
  undefined1 auStack_2f0 [24];
  uint64_t uStack_2d8;
  uint64_t uStack_2d0;
  int iStack_2c8;
  int iStack_2c4;
  secp256k1_fe sStack_290;
  int iStack_260;
  secp256k1_ge sStack_250;
  secp256k1_gej *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  code *pcStack_1c0;
  secp256k1_gej *local_1b0;
  undefined1 local_1a8 [56];
  uint64_t uStack_170;
  undefined1 local_168 [16];
  uint64_t local_158;
  uint uStack_150;
  int iStack_14c;
  secp256k1_fe local_148;
  secp256k1_fe local_118;
  secp256k1_fe local_e8;
  uint64_t local_b8;
  uint64_t uStack_b0;
  uint64_t local_a8;
  uint64_t uStack_a0;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  bVar54 = 0;
  psVar43 = (secp256k1_fe *)0xf000000000000;
  local_118.n[0] = u->n[0];
  local_118.n[1] = u->n[1];
  local_118.n[2] = u->n[2];
  local_118.n[3] = u->n[3];
  local_118.n[4] = u->n[4];
  local_118.magnitude = u->magnitude;
  local_118.normalized = u->normalized;
  pcStack_1c0 = (code *)0x1104f3;
  local_1b0 = (secp256k1_gej *)xn;
  secp256k1_fe_verify(&local_118);
  psVar24 = (secp256k1_gej *)0x1000003d1;
  uVar11 = (local_118.n[4] >> 0x30) * 0x1000003d1 + local_118.n[0];
  psVar42 = (secp256k1_fe *)0xffffefffffc2f;
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
    uVar21 = (uVar11 >> 0x34) + local_118.n[1];
    uVar31 = (uVar21 >> 0x34) + local_118.n[2];
    uVar36 = (uVar31 >> 0x34) + local_118.n[3];
    in_R8 = (uVar36 >> 0x34) + (local_118.n[4] & 0xffffffffffff);
    if (((uVar21 | uVar11 | uVar31 | uVar36) & 0xfffffffffffff) == 0 && in_R8 == 0)
    goto LAB_00110c3c;
    in_R8 = in_R8 ^ 0xf000000000000;
    if (((uVar11 | 0x1000003d0) & uVar21 & uVar31 & uVar36 & in_R8) == 0xfffffffffffff)
    goto LAB_00110c3c;
  }
  while( true ) {
    pcStack_1c0 = (code *)0x1105b6;
    secp256k1_fe_sqr(&local_148,t);
    pcStack_1c0 = (code *)0x1105be;
    secp256k1_fe_verify(t);
    uVar11 = (t->n[4] >> 0x30) * 0x1000003d1 + t->n[0];
    if (((secp256k1_fe *)(uVar11 & 0xfffffffffffff) == psVar42) ||
       ((secp256k1_fe *)(uVar11 & 0xfffffffffffff) == (secp256k1_fe *)0x0)) {
      uVar21 = (uVar11 >> 0x34) + t->n[1];
      uVar31 = (uVar21 >> 0x34) + t->n[2];
      uVar36 = (uVar31 >> 0x34) + t->n[3];
      in_R8 = (uVar36 >> 0x34) + (t->n[4] & 0xffffffffffff);
      if ((((uVar21 | uVar11 | uVar31 | uVar36) & 0xfffffffffffff) == 0 && in_R8 == 0) ||
         (in_R8 = in_R8 ^ (ulong)psVar43,
         ((uVar11 | 0x1000003d0) & uVar21 & uVar31 & uVar36 & in_R8) == 0xfffffffffffff)) {
        local_148.n[4] = 0;
        local_148.magnitude = 1;
        local_148.normalized = 1;
        local_148.n[2] = 0;
        local_148.n[3] = 0;
        local_148.n[0] = 1;
        local_148.n[1] = 0;
      }
    }
    pcStack_1c0 = (code *)0x11066d;
    secp256k1_fe_sqr((secp256k1_fe *)local_1a8,&local_118);
    psVar43 = &local_60;
    pcStack_1c0 = (code *)0x110683;
    secp256k1_fe_mul(psVar43,(secp256k1_fe *)local_1a8,&local_118);
    pcStack_1c0 = (code *)0x11068b;
    secp256k1_fe_verify(psVar43);
    local_60.n[0] = local_60.n[0] + 2;
    local_60.magnitude = local_60.magnitude + 1;
    local_60.normalized = 0;
    pcStack_1c0 = (code *)0x1106a4;
    secp256k1_fe_verify(psVar43);
    t = &local_e8;
    local_e8.n[4] = CONCAT44(local_60.n[4]._4_4_,(undefined4)local_60.n[4]);
    local_e8.magnitude = local_60.magnitude;
    local_e8.normalized = local_60.normalized;
    local_e8.n[2] = local_60.n[2];
    local_e8.n[3] = local_60.n[3];
    local_e8.n[1] = local_60.n[1];
    local_e8.n[0] = local_60.n[0];
    pcStack_1c0 = (code *)0x1106d1;
    secp256k1_fe_verify(t);
    psVar42 = &local_148;
    pcStack_1c0 = (code *)0x1106de;
    secp256k1_fe_verify(psVar42);
    if (local_148.magnitude + local_e8.magnitude < 0x21) break;
    pcStack_1c0 = (code *)0x110c3c;
    secp256k1_ellswift_xswiftec_frac_var_cold_7();
LAB_00110c3c:
    local_118.n[4] = 0;
    local_118.magnitude = 1;
    local_118.normalized = 1;
    local_118.n[2] = 0;
    local_118.n[3] = 0;
    local_118.n[0] = 1;
    local_118.n[1] = 0;
  }
  local_a8 = local_e8.n[0] + local_148.n[0];
  uStack_a0 = local_e8.n[1] + local_148.n[1];
  local_e8.n[2] = local_e8.n[2] + local_148.n[2];
  local_e8.n[3] = local_e8.n[3] + local_148.n[3];
  uVar21 = local_e8.n[4] + local_148.n[4];
  local_e8.normalized = 0;
  pcStack_1c0 = (code *)0x110753;
  local_e8.n[4] = uVar21;
  local_e8.magnitude = local_148.magnitude + local_e8.magnitude;
  local_b8 = local_e8.n[2];
  uStack_b0 = local_e8.n[3];
  local_e8.n[0] = local_a8;
  local_e8.n[1] = uStack_a0;
  secp256k1_fe_verify(&local_e8);
  pcStack_1c0 = (code *)0x11075b;
  secp256k1_fe_verify(&local_e8);
  uVar11 = local_a8 + (uVar21 >> 0x30) * 0x1000003d1;
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
    uVar31 = uStack_a0 + (uVar11 >> 0x34);
    uVar36 = local_b8 + (uVar31 >> 0x34);
    uVar32 = uStack_b0 + (uVar36 >> 0x34);
    uVar21 = (uVar32 >> 0x34) + (uVar21 & 0xffffffffffff);
    in_R8 = (uVar31 | uVar11 | uVar36 | uVar32) & 0xfffffffffffff | uVar21;
    if (in_R8 == 0) goto LAB_00110ca2;
    in_R8 = 0x1000003d0;
    if (((uVar11 | 0x1000003d0) & uVar31 & uVar36 & uVar32 & (uVar21 ^ 0xf000000000000)) ==
        0xfffffffffffff) goto LAB_00110ca2;
  }
  while( true ) {
    pcStack_1c0 = (code *)0x11084d;
    secp256k1_fe_mul(&local_90,&local_148,(secp256k1_fe *)local_1a8);
    pcStack_1c0 = (code *)0x110855;
    secp256k1_fe_verify(&local_90);
    if (local_90.magnitude < 0xb) break;
    pcStack_1c0 = (code *)0x110ca2;
    secp256k1_ellswift_xswiftec_frac_var_cold_6();
LAB_00110ca2:
    pcStack_1c0 = (code *)0x110cbc;
    secp256k1_ellswift_xswiftec_frac_var_cold_1();
  }
  local_90.magnitude = local_90.magnitude * 3;
  psVar43 = &local_90;
  local_90.n[0] = local_90.n[0] * 3;
  local_90.n[1] = local_90.n[1] * 3;
  local_90.n[2] = local_90.n[2] * 3;
  local_90.n[3] = local_90.n[3] * 3;
  psVar46 = (secp256k1_scalar *)(local_90.n[4] * 3);
  local_90.normalized = 0;
  pcStack_1c0 = (code *)0x1108bb;
  local_90.n[4] = (uint64_t)psVar46;
  secp256k1_fe_verify(psVar43);
  pcStack_1c0 = (code *)0x1108d0;
  secp256k1_fe_sqr((secp256k1_fe *)local_1a8,&local_e8);
  pcStack_1c0 = (code *)0x1108d8;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  pcStack_1c0 = (code *)0x1108e7;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_1a8._40_8_ & 0xffffffff),1);
  local_1a8._0_8_ = 0x3ffffbfffff0bc - local_1a8._0_8_;
  local_1a8._8_8_ = 0x3ffffffffffffc - local_1a8._8_8_;
  local_1a8._16_8_ = 0x3ffffffffffffc - local_1a8._16_8_;
  local_1a8._24_8_ = 0x3ffffffffffffc - local_1a8._24_8_;
  local_1a8._32_8_ = 0x3fffffffffffc - local_1a8._32_8_;
  local_1a8._40_4_ = 2;
  local_1a8._44_4_ = 0;
  pcStack_1c0 = (code *)0x110936;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  psVar42 = (secp256k1_fe *)(local_1a8 + 0x30);
  pcStack_1c0 = (code *)0x11094e;
  a_00 = psVar43;
  secp256k1_fe_mul(psVar42,psVar43,&local_118);
  pcStack_1c0 = (code *)0x110956;
  secp256k1_fe_verify(psVar42);
  pcStack_1c0 = (code *)0x11095e;
  psVar33 = (secp256k1_gej *)local_1a8;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  if ((int)(local_1a8._40_4_ + uStack_150) < 0x21) {
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168._8_8_ = local_168._8_8_ + local_1a8._24_8_;
    local_168._0_8_ = local_168._0_8_ + local_1a8._16_8_;
    local_158 = local_158 + local_1a8._32_8_;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x1109b4;
    psVar46 = (secp256k1_scalar *)local_1a8._32_8_;
    uStack_150 = local_1a8._40_4_ + uStack_150;
    secp256k1_fe_verify((secp256k1_fe *)(local_1a8 + 0x30));
    pcStack_1c0 = (code *)0x1109c4;
    iVar7 = secp256k1_ge_x_frac_on_curve_var((secp256k1_fe *)(local_1a8 + 0x30),&local_90);
    if (iVar7 != 0) {
      (local_1b0->x).n[4] = local_158;
      (local_1b0->x).magnitude = uStack_150;
      (local_1b0->x).normalized = iStack_14c;
      (local_1b0->x).n[2] = local_168._0_8_;
      (local_1b0->x).n[3] = local_168._8_8_;
      (local_1b0->x).n[0] = local_1a8._48_8_;
      (local_1b0->x).n[1] = uStack_170;
      xd->n[4] = local_90.n[4];
      xd->magnitude = local_90.magnitude;
      xd->normalized = local_90.normalized;
      xd->n[2] = local_90.n[2];
      xd->n[3] = local_90.n[3];
      xd->n[0] = local_90.n[0];
      xd->n[1] = local_90.n[1];
      return;
    }
    auVar2._8_8_ = local_e8.n[3];
    auVar2._0_8_ = local_e8.n[2];
    *(undefined4 *)(xd->n + 4) = (undefined4)local_e8.n[4];
    *(undefined4 *)((long)xd->n + 0x24) = local_e8.n[4]._4_4_;
    xd->magnitude = local_e8.magnitude;
    xd->normalized = local_e8.normalized;
    *(undefined1 (*) [16])(xd->n + 2) = auVar2;
    xd->n[0] = local_e8.n[0];
    xd->n[1] = local_e8.n[1];
    xd = (secp256k1_fe *)local_1a8;
    pcStack_1c0 = (code *)0x110a55;
    secp256k1_fe_mul(xd,&secp256k1_ellswift_c1,&local_148);
    a_00 = &secp256k1_ellswift_c2;
    psVar43 = (secp256k1_fe *)(local_1a8 + 0x30);
    pcStack_1c0 = (code *)0x110a71;
    secp256k1_fe_mul(psVar43,&secp256k1_ellswift_c2,&local_60);
    pcStack_1c0 = (code *)0x110a79;
    secp256k1_fe_verify(psVar43);
    pcStack_1c0 = (code *)0x110a81;
    psVar33 = (secp256k1_gej *)xd;
    secp256k1_fe_verify(xd);
    if (0x20 < (int)(local_1a8._40_4_ + uStack_150)) goto LAB_00110cc6;
    psVar43 = (secp256k1_fe *)(local_1a8 + 0x30);
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168._0_8_ = local_168._0_8_ + local_1a8._16_8_;
    local_168._8_8_ = local_168._8_8_ + local_1a8._24_8_;
    local_158 = local_158 + local_1a8._32_8_;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x110ad6;
    psVar46 = (secp256k1_scalar *)local_1a8._32_8_;
    uStack_150 = local_1a8._40_4_ + uStack_150;
    secp256k1_fe_verify(psVar43);
    pcStack_1c0 = (code *)0x110ae9;
    secp256k1_fe_mul(psVar43,psVar43,&local_118);
    pcStack_1c0 = (code *)0x110af9;
    iVar7 = secp256k1_ge_x_frac_on_curve_var(psVar43,&local_e8);
    if (iVar7 != 0) {
      (local_1b0->x).n[4] = local_158;
      (local_1b0->x).magnitude = uStack_150;
      (local_1b0->x).normalized = iStack_14c;
      (local_1b0->x).n[2] = local_168._0_8_;
      (local_1b0->x).n[3] = local_168._8_8_;
      (local_1b0->x).n[0] = local_1a8._48_8_;
      (local_1b0->x).n[1] = uStack_170;
      return;
    }
    xd = (secp256k1_fe *)local_1a8;
    a_00 = &local_e8;
    pcStack_1c0 = (code *)0x110b42;
    secp256k1_fe_mul(xd,a_00,&local_118);
    psVar43 = (secp256k1_fe *)(local_1a8 + 0x30);
    pcStack_1c0 = (code *)0x110b4f;
    secp256k1_fe_verify(psVar43);
    pcStack_1c0 = (code *)0x110b57;
    psVar33 = (secp256k1_gej *)xd;
    secp256k1_fe_verify(xd);
    if (0x20 < (int)(local_1a8._40_4_ + uStack_150)) goto LAB_00110ccb;
    xd = (secp256k1_fe *)(local_1a8 + 0x30);
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168._0_8_ = local_168._0_8_ + local_1a8._16_8_;
    local_168._8_8_ = local_168._8_8_ + local_1a8._24_8_;
    local_158 = local_158 + local_1a8._32_8_;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x110bac;
    psVar46 = (secp256k1_scalar *)local_1a8._32_8_;
    uStack_150 = local_1a8._40_4_ + uStack_150;
    secp256k1_fe_verify(xd);
    pcStack_1c0 = (code *)0x110bb4;
    secp256k1_fe_verify(xd);
    pcStack_1c0 = (code *)0x110bc2;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)uStack_150,2);
    psVar24 = local_1b0;
    (local_1b0->x).n[0] = 0x5ffff9ffffe91a - local_1a8._48_8_;
    (local_1b0->x).n[1] = 0x5ffffffffffffa - uStack_170;
    (local_1b0->x).n[2] = 0x5ffffffffffffa - local_168._0_8_;
    (local_1b0->x).n[3] = 0x5ffffffffffffa - local_168._8_8_;
    (local_1b0->x).n[4] = 0x5fffffffffffa - local_158;
    (local_1b0->x).magnitude = 3;
    (local_1b0->x).normalized = 0;
    pcStack_1c0 = (code *)0x110c0d;
    secp256k1_fe_verify(&local_1b0->x);
    a_00 = &local_e8;
    pcStack_1c0 = (code *)0x110c1d;
    psVar33 = psVar24;
    iVar7 = secp256k1_ge_x_frac_on_curve_var(&psVar24->x,a_00);
    if (iVar7 != 0) {
      return;
    }
  }
  else {
    pcStack_1c0 = (code *)0x110cc6;
    secp256k1_ellswift_xswiftec_frac_var_cold_5();
LAB_00110cc6:
    pcStack_1c0 = (code *)0x110ccb;
    secp256k1_ellswift_xswiftec_frac_var_cold_4();
LAB_00110ccb:
    pcStack_1c0 = (code *)0x110cd0;
    secp256k1_ellswift_xswiftec_frac_var_cold_3();
  }
  pcStack_1c0 = secp256k1_ecmult_const_xonly;
  secp256k1_ellswift_xswiftec_frac_var_cold_2();
  pcStack_1c0 = (code *)0xfffffffffffff;
  psVar44 = (secp256k1_gej *)auStack_350;
  pcStack_368 = (code *)0x110d02;
  psStack_1e8 = psVar24;
  psStack_1e0 = (secp256k1_gej *)local_1a8;
  psStack_1d8 = psVar42;
  psStack_1d0 = (secp256k1_gej *)xd;
  psStack_1c8 = psVar43;
  secp256k1_fe_sqr((secp256k1_fe *)psVar44,a_00);
  pcStack_368 = (code *)0x110d10;
  secp256k1_fe_mul((secp256k1_fe *)psVar44,(secp256k1_fe *)psVar44,a_00);
  psStack_358 = psVar33;
  if (a == (secp256k1_fe *)0x0) {
    pcStack_368 = (code *)0x110ec8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_350);
    auStack_350._0_8_ = auStack_350._0_8_ + 2;
    iStack_328 = iStack_328 + 1;
    iStack_324 = 0;
    pcStack_368 = (code *)0x110ede;
    secp256k1_fe_verify((secp256k1_fe *)auStack_350);
    if ((int)in_R8 == 0) {
      psVar13 = (secp256k1_ge *)auStack_350;
LAB_00110ee7:
      pcStack_368 = (code *)0x110eec;
      iVar7 = secp256k1_fe_is_square_var(&psVar13->x);
      if (iVar7 == 0) {
        return;
      }
    }
LAB_00110ef4:
    psVar33 = (secp256k1_gej *)auStack_350;
    pcStack_368 = (code *)0x110f0c;
    secp256k1_fe_mul(&sStack_250.x,(secp256k1_fe *)psVar33,a_00);
    a_00 = &sStack_250.y;
    pcStack_368 = (code *)0x110f1f;
    secp256k1_fe_sqr(a_00,(secp256k1_fe *)psVar33);
    sStack_250.infinity = 0;
    psVar24 = (secp256k1_gej *)(ulong)*psVar46;
    pcStack_368 = (code *)0x110f30;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
    if (*psVar46 == 0) {
      pcStack_368 = (code *)0x110fdf;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      psVar33 = (secp256k1_gej *)auStack_2f0;
      pcStack_368 = (code *)0x110f52;
      secp256k1_ecmult_const(psVar33,&sStack_250,psVar46);
      pcStack_368 = (code *)0x110f5a;
      psVar24 = psVar33;
      secp256k1_gej_verify(psVar33);
      if (iStack_260 == 0) {
        pcStack_368 = (code *)0x110f78;
        secp256k1_fe_sqr(&sStack_320,&sStack_290);
        pcStack_368 = (code *)0x110f88;
        secp256k1_fe_mul(&sStack_320,&sStack_320,(secp256k1_fe *)auStack_350);
        if (a != (secp256k1_fe *)0x0) {
          pcStack_368 = (code *)0x110f9d;
          secp256k1_fe_mul(&sStack_320,&sStack_320,a);
        }
        pcStack_368 = (code *)0x110fad;
        secp256k1_fe_inv(&sStack_320,&sStack_320);
        pcStack_368 = (code *)0x110fbf;
        secp256k1_fe_mul(&psStack_358->x,(secp256k1_fe *)auStack_2f0,&sStack_320);
        return;
      }
    }
    pcStack_368 = (code *)0x110fe4;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00110fe4:
    pcStack_368 = (code *)0x110fe9;
    secp256k1_ecmult_const_xonly_cold_1();
  }
  else {
    pcStack_368 = (code *)0x110d26;
    secp256k1_fe_verify(a);
    uVar11 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
    uVar21 = (uVar11 >> 0x34) + a->n[1];
    uVar31 = (uVar21 >> 0x34) + a->n[2];
    psVar24 = (secp256k1_gej *)((uVar31 >> 0x34) + a->n[3]);
    uVar36 = ((ulong)psVar24 >> 0x34) + (a->n[4] & 0xffffffffffff);
    if ((((uVar21 | uVar11 | uVar31 | (ulong)psVar24) & 0xfffffffffffff) == 0 && uVar36 == 0) ||
       (((uVar11 ^ 0x1000003d0) & uVar21 & uVar31 & (ulong)psVar24 & (uVar36 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_00110fe4;
    psVar44 = (secp256k1_gej *)auStack_2f0;
    pcStack_368 = (code *)0x110dd2;
    secp256k1_fe_sqr((secp256k1_fe *)psVar44,a);
    pcStack_368 = (code *)0x110dda;
    psVar24 = psVar44;
    secp256k1_fe_verify((secp256k1_fe *)psVar44);
    if (iStack_2c8 < 0x11) {
      psVar44 = (secp256k1_gej *)auStack_2f0;
      auStack_2f0._0_8_ = auStack_2f0._0_8_ * 2;
      auStack_2f0._8_8_ = auStack_2f0._8_8_ * 2;
      uStack_2d8 = uStack_2d8 * 2;
      auStack_2f0._16_8_ = auStack_2f0._16_8_ * 2;
      uStack_2d0 = uStack_2d0 << 1;
      iStack_2c8 = iStack_2c8 * 2;
      iStack_2c4 = 0;
      pcStack_368 = (code *)0x110e26;
      secp256k1_fe_verify((secp256k1_fe *)psVar44);
      pcStack_368 = (code *)0x110e34;
      secp256k1_fe_mul((secp256k1_fe *)psVar44,(secp256k1_fe *)psVar44,a);
      psVar33 = (secp256k1_gej *)auStack_350;
      pcStack_368 = (code *)0x110e41;
      secp256k1_fe_verify((secp256k1_fe *)psVar33);
      pcStack_368 = (code *)0x110e49;
      psVar24 = psVar44;
      secp256k1_fe_verify((secp256k1_fe *)psVar44);
      if (0x20 < iStack_2c8 + iStack_328) goto LAB_00110fee;
      auStack_350._0_8_ = auStack_350._0_8_ + auStack_2f0._0_8_;
      auStack_350._8_8_ = auStack_350._8_8_ + auStack_2f0._8_8_;
      auStack_350._16_8_ = auStack_350._16_8_ + auStack_2f0._16_8_;
      uStack_338 = uStack_338 + uStack_2d8;
      uStack_330 = uStack_330 + uStack_2d0;
      iStack_324 = 0;
      pcStack_368 = (code *)0x110e9a;
      iStack_328 = iStack_2c8 + iStack_328;
      secp256k1_fe_verify((secp256k1_fe *)auStack_350);
      if ((int)in_R8 == 0) {
        psVar13 = &sStack_250;
        pcStack_368 = (code *)0x110eb6;
        secp256k1_fe_mul(&psVar13->x,(secp256k1_fe *)auStack_350,a);
        goto LAB_00110ee7;
      }
      goto LAB_00110ef4;
    }
  }
  pcStack_368 = (code *)0x110fee;
  secp256k1_ecmult_const_xonly_cold_3();
LAB_00110fee:
  pcStack_368 = secp256k1_fe_normalize;
  secp256k1_ecmult_const_xonly_cold_2();
  pcStack_380 = (code *)0x111014;
  psStack_378 = psVar33;
  pcStack_368 = (code *)psVar46;
  secp256k1_fe_verify(&psVar24->x);
  uVar11 = (psVar24->x).n[4];
  uVar21 = (uVar11 >> 0x30) * 0x1000003d1 + (psVar24->x).n[0];
  uVar36 = (uVar21 >> 0x34) + (psVar24->x).n[1];
  uVar31 = (uVar36 >> 0x34) + (psVar24->x).n[2];
  uVar32 = uVar31 & 0xfffffffffffff;
  uVar31 = (uVar31 >> 0x34) + (psVar24->x).n[3];
  uVar11 = (uVar31 >> 0x34) + (uVar11 & 0xffffffffffff);
  uVar21 = uVar21 & 0xfffffffffffff;
  uVar39 = (ulong)(0xffffefffffc2e < uVar21 &&
                  ((uVar32 & uVar36 & uVar31) == 0xfffffffffffff && uVar11 == 0xffffffffffff)) |
           uVar11 >> 0x30;
  uVar21 = uVar39 * 0x1000003d1 + uVar21;
  uVar36 = (uVar21 >> 0x34) + (uVar36 & 0xfffffffffffff);
  psVar33 = (secp256k1_gej *)((uVar36 >> 0x34) + uVar32);
  uVar31 = ((ulong)psVar33 >> 0x34) + (uVar31 & 0xfffffffffffff);
  uVar11 = (uVar31 >> 0x34) + uVar11;
  if ((uint)(ushort)(uVar11 >> 0x30) == (uint)uVar39) {
    (psVar24->x).n[0] = uVar21 & 0xfffffffffffff;
    (psVar24->x).n[1] = uVar36 & 0xfffffffffffff;
    (psVar24->x).n[2] = (ulong)psVar33 & 0xfffffffffffff;
    (psVar24->x).n[3] = uVar31 & 0xfffffffffffff;
    (psVar24->x).n[4] = uVar11 & 0xffffffffffff;
    (psVar24->x).magnitude = 1;
    (psVar24->x).normalized = 1;
    secp256k1_fe_verify(&psVar24->x);
    return;
  }
  pcStack_380 = main;
  secp256k1_fe_normalize_cold_1();
  uStack_388 = 0xfffffffffffff;
  uStack_390 = 0xffffffffffff;
  psStack_3a8 = psVar24;
  psStack_3a0 = a_00;
  psStack_398 = psVar44;
  pcStack_380 = (code *)(in_R8 & 0xffffffff);
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  iVar7 = (int)uVar31;
  psStack_1e68 = (secp256k1_gej *)(uVar31 & 0xffffffff);
  psStack_1e30 = psVar33;
  if (iVar7 < 2) {
    printf("test count = %i\n",(ulong)(uint)count);
  }
  else {
    uVar11 = strtol((char *)(psVar33->x).n[1],(char **)0x0,0);
    count = (int)uVar11;
    printf("test count = %i\n",uVar11 & 0xffffffff);
    if (iVar7 != 2) {
      pcVar25 = (char *)(psVar33->x).n[2];
      asStack_1530[0].ecmult_gen_ctx.built = 0;
      asStack_1530[0].ecmult_gen_ctx.scalar_offset = 0;
      asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
      if ((pcVar25 != (char *)0x0) && (*pcVar25 != '\0')) {
        lVar45 = 0;
        do {
          psStack_1e68._0_4_ = iVar7;
          if (pcVar25[1] == '\0') goto LAB_00111287;
          iVar8 = __isoc99_sscanf(pcVar25,"%2hx",auStack_b60);
          if (iVar8 != 1) goto LAB_00111287;
          auStack_1590[lVar45 + 0x60] = auStack_b60[0];
          if (lVar45 == 0xf) goto LAB_00111287;
          lVar45 = lVar45 + 1;
          pcVar1 = pcVar25 + 2;
          pcVar25 = pcVar25 + 2;
          if (*pcVar1 == '\0') goto LAB_00111287;
        } while( true );
      }
    }
  }
  asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  asStack_1530[0].ecmult_gen_ctx.built = 0;
  asStack_1530[0].ecmult_gen_ctx.scalar_offset = 0;
  __stream = fopen("/dev/urandom","rb");
  if ((__stream != (FILE *)0x0) &&
     (sVar12 = fread(auStack_1590 + 0x60,1,0x10,__stream), sVar12 == 0x10)) goto LAB_0011127f;
LAB_00113ddf:
  main_cold_1();
  iVar7 = (int)psStack_1e68;
  if ((extraout_RAX & 1) == 0) {
LAB_0011127f:
    psStack_1e68._0_4_ = iVar7;
    fclose(__stream);
  }
LAB_00111287:
  na = (code *)((ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff);
  lVar45 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
  auStack_b60._0_8_ = 0xbb67ae856a09e667;
  auStack_b60._8_8_ = 0xa54ff53a3c6ef372;
  auStack_b60._16_8_ = 0x9b05688c510e527f;
  auStack_b60._24_8_ = 0x5be0cd191f83d9ab;
  auStack_b60._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_b60,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_b60,auStack_1590 + 0x60,0x10);
  puVar51 = auStack_10b0;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_b60,puVar51);
  psVar24 = psStack_1e30;
  do {
    psVar42 = (secp256k1_fe *)0x0;
    uVar11 = 0;
    do {
      uVar11 = (ulong)puVar51[(long)psVar42] | uVar11 << 8;
      psVar42 = (secp256k1_fe *)((long)psVar42->n + 1);
    } while (psVar42 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar45] = uVar11;
    lVar45 = lVar45 + 1;
    puVar51 = puVar51 + 8;
  } while (lVar45 != 4);
  if (4 < (int)psStack_1e68) {
    lVar45 = strtol((char *)(psStack_1e30->x).n[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar45;
    uVar11 = strtol((char *)(psVar24->x).n[4],(char **)0x0,0);
    this_core = (uint32_t)uVar11;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00113e07:
      main_cold_2();
      return;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar11 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  r = (secp256k1_context *)0xd0;
  psVar13 = (secp256k1_ge *)malloc(0xd0);
  if (psVar13 == (secp256k1_ge *)0x0) goto LAB_00113e91;
  r = (secp256k1_context *)0x130;
  psVar24 = (secp256k1_gej *)malloc(0x130);
  if (psVar24 != (secp256k1_gej *)0x0) {
    r = (secp256k1_context *)0x130;
    psStack_1e68 = (secp256k1_gej *)malloc(0x130);
    if (psStack_1e68 == (secp256k1_gej *)0x0) goto LAB_00113e9b;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_b60);
    uVar23 = 0xff;
    do {
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      if ((uVar23 < 0x20) && ((7U >> (uVar23 & 0x1f) & 1) != 0)) {
        psVar42 = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,&secp256k1_ge_const_g,
                   (secp256k1_fe *)0x0);
      }
      bVar53 = uVar23 != 0;
      uVar23 = uVar23 - 1;
    } while (bVar53);
    r = (secp256k1_context *)auStack_10b0;
    secp256k1_gej_double_var((secp256k1_gej *)r,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
    iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)r,&secp256k1_ge_const_g);
    if (iVar7 == 0) {
LAB_00113e64:
      main_cold_70();
    }
    else {
      secp256k1_gej_set_infinity((secp256k1_gej *)auStack_10b0);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_10b0,(secp256k1_gej *)auStack_10b0,
                 (secp256k1_gej *)auStack_b60,psVar42);
      lVar26 = 0;
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      memcpy(psVar24,(secp256k1_gej *)auStack_b60,0x98);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_10b0,(secp256k1_gej *)auStack_10b0,
                 (secp256k1_gej *)auStack_b60,psVar42);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      memcpy(psVar24 + 1,(secp256k1_gej *)auStack_b60,0x98);
      secp256k1_gej_neg(psStack_1e68,(secp256k1_gej *)auStack_10b0);
      secp256k1_gej_add_var(psStack_1e68 + 1,psStack_1e68,psVar24,psVar42);
      secp256k1_gej_verify(psStack_1e68);
      secp256k1_gej_verify(psStack_1e68 + 1);
      lVar45 = -1;
      bVar53 = true;
      do {
        bVar22 = bVar53;
        if (psStack_1e68[lVar26].infinity == 0) {
          psVar37 = psVar13 + lVar26;
          if (lVar45 == -1) {
            uVar38 = psStack_1e68[lVar26].z.n[0];
            uVar28 = psStack_1e68[lVar26].z.n[1];
            auVar2 = *(undefined1 (*) [16])(psStack_1e68[lVar26].z.n + 2);
            uVar17 = *(undefined4 *)((long)psStack_1e68[lVar26].z.n + 0x24);
            iVar7 = psStack_1e68[lVar26].z.magnitude;
            iVar8 = psStack_1e68[lVar26].z.normalized;
            *(int *)((psVar37->x).n + 4) = (int)psStack_1e68[lVar26].z.n[4];
            *(undefined4 *)((long)(psVar37->x).n + 0x24) = uVar17;
            (psVar37->x).magnitude = iVar7;
            (psVar37->x).normalized = iVar8;
            *(undefined1 (*) [16])((psVar37->x).n + 2) = auVar2;
            (psVar37->x).n[0] = uVar38;
            (psVar37->x).n[1] = uVar28;
            lVar45 = lVar26;
          }
          else {
            secp256k1_fe_mul(&psVar37->x,&psVar13[lVar45].x,&psStack_1e68[lVar26].z);
            lVar45 = lVar26;
          }
        }
        else {
          secp256k1_ge_set_infinity(psVar13 + lVar26);
        }
        lVar26 = 1;
        bVar53 = false;
      } while (bVar22);
      if (lVar45 == -1) goto LAB_0011170d;
      r = (secp256k1_context *)auStack_10b0;
      secp256k1_fe_inv_var((secp256k1_fe *)r,&psVar13[lVar45].x);
      if (lVar45 == 0) {
LAB_0011167c:
        lVar45 = 0;
      }
      else if (psStack_1e68->infinity == 0) {
        r = (secp256k1_context *)auStack_10b0;
        secp256k1_fe_mul(&psVar13[lVar45].x,(secp256k1_fe *)psVar13,(secp256k1_fe *)r);
        secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,&psStack_1e68[lVar45].z);
        goto LAB_0011167c;
      }
      if (psStack_1e68[lVar45].infinity == 0) {
        puVar35 = psVar13[lVar45].x.n + 4;
        *(undefined4 *)puVar35 = uStack_1090;
        *(undefined4 *)((long)puVar35 + 4) = uStack_108c;
        *(int *)(puVar35 + 1) = iStack_1088;
        *(int *)((long)puVar35 + 0xc) = iStack_1084;
        *(undefined1 (*) [16])(psVar13[lVar45].x.n + 2) = auStack_10b0._16_16_;
        psVar13[lVar45].x.n[0] = auStack_10b0._0_8_;
        psVar13[lVar45].x.n[1] = auStack_10b0._8_8_;
        lVar45 = 0;
        bVar53 = true;
        do {
          bVar22 = bVar53;
          if (psStack_1e68[lVar45].infinity == 0) {
            secp256k1_ge_set_gej_zinv(psVar13 + lVar45,psStack_1e68 + lVar45,&psVar13[lVar45].x);
          }
          lVar45 = 1;
          bVar53 = false;
        } while (bVar22);
        secp256k1_ge_verify(psVar13);
        secp256k1_ge_verify(psVar13 + 1);
LAB_0011170d:
        lVar45 = 0;
        bVar53 = true;
LAB_0011171e:
        psVar14 = (secp256k1_context *)(psVar13 + lVar45);
        r = psVar14;
        secp256k1_ge_verify((secp256k1_ge *)psVar14);
        if (psVar13[lVar45].infinity == 0) goto code_r0x0011173a;
        main_cold_4();
LAB_00113e1e:
        main_cold_52();
LAB_00113e23:
        main_cold_5();
LAB_00113e28:
        main_cold_6();
LAB_00113e2d:
        main_cold_68();
LAB_00113e32:
        main_cold_67();
LAB_00113e37:
        main_cold_66();
LAB_00113e3c:
        main_cold_7();
LAB_00113e41:
        main_cold_8();
LAB_00113e46:
        main_cold_60();
LAB_00113e4b:
        main_cold_59();
LAB_00113e50:
        main_cold_58();
LAB_00113e55:
        main_cold_57();
LAB_00113e5a:
        main_cold_49();
LAB_00113e5f:
        main_cold_55();
        goto LAB_00113e64;
      }
    }
    main_cold_3();
LAB_00113e6e:
    main_cold_54();
LAB_00113e73:
    main_cold_53();
LAB_00113e78:
    main_cold_51();
LAB_00113e7d:
    main_cold_50();
    goto LAB_00113e82;
  }
  goto LAB_00113e96;
code_r0x0011173a:
  secp256k1_ge_to_storage(secp256k1_ecmult_gen_prec_table[0] + lVar45,(secp256k1_ge *)psVar14);
  lVar45 = 1;
  bVar22 = !bVar53;
  bVar53 = false;
  if (bVar22) goto code_r0x0011175c;
  goto LAB_0011171e;
LAB_00113dc2:
  main_cold_63();
LAB_00113dc7:
  main_cold_62();
LAB_00113dcc:
  main_cold_61();
  goto LAB_00113ddf;
code_r0x0011175c:
  free(psStack_1e68);
  free(psVar24);
  free(psVar13);
  secp256k1_gej_set_ge((secp256k1_gej *)auStack_b60,&secp256k1_ge_const_g);
  secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_b60,gen);
  iVar7 = 0x80;
  do {
    secp256k1_gej_double_var
              ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_b60,gen_00);
  iVar7 = count;
  while( true ) {
    count = iVar7 + -1;
    if (iVar7 == 0) {
      testrand256(auStack_1590 + 0x60);
      printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
             asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x38,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
      puts("no problems found");
      return;
    }
    psVar24 = (secp256k1_gej *)(auStack_1590 + 0x60);
    psVar14 = secp256k1_context_create(1);
    testrand256(auStack_1b50);
    r = psVar14;
    iVar7 = secp256k1_context_randomize(psVar14,auStack_1b50);
    if (iVar7 == 0) break;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_b60);
    secp256k1_ge_set_gej((secp256k1_ge *)auStack_10b0,(secp256k1_gej *)auStack_b60);
    lVar45 = -0x4e0;
    uVar23 = 1;
    psVar33 = (secp256k1_gej *)auStack_b60;
    do {
      psVar44 = psVar33 + 1;
      secp256k1_gej_add_ge(psVar44,psVar33,&secp256k1_ge_const_g);
      secp256k1_ge_set_gej((secp256k1_ge *)(auStack_b68 + lVar45),psVar44);
      if (count != 0) {
        testutil_random_fe((secp256k1_fe *)psVar24);
        secp256k1_gej_rescale(psVar44,(secp256k1_fe *)psVar24);
      }
      auStack_1830._0_4_ = uVar23;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
      secp256k1_ecmult_gen(&psVar14->ecmult_gen_ctx,psVar24,(secp256k1_scalar *)auStack_1830);
      r = (secp256k1_context *)auStack_1b30;
      secp256k1_ge_set_gej((secp256k1_ge *)r,psVar24);
      if (*(int *)(auStack_b60 + lVar45 + 0x58) != 0) goto LAB_00113e23;
      if (iStack_1ad0 != 0) goto LAB_00113e28;
      r = (secp256k1_context *)auStack_1b30;
      iVar7 = secp256k1_fe_equal((secp256k1_fe *)r,(secp256k1_fe *)(auStack_b68 + lVar45));
      if (iVar7 == 0) goto LAB_00113e2d;
      r = (secp256k1_context *)(auStack_1b30 + 0x30);
      iVar7 = secp256k1_fe_equal((secp256k1_fe *)r,(secp256k1_fe *)(auStack_b60 + lVar45 + 0x28));
      if (iVar7 == 0) goto LAB_00113e32;
      uVar23 = uVar23 + 1;
      lVar45 = lVar45 + 0x68;
      psVar33 = psVar44;
    } while (lVar45 != 0);
    uVar11 = 0;
    puVar49 = auStack_10b0;
    lVar45 = 0;
    do {
      r = (secp256k1_context *)(puVar49 + (uVar11 / 0xd) * -0x548);
      secp256k1_ge_mul_lambda((secp256k1_ge *)psVar24,(secp256k1_ge *)(auStack_10b0 + lVar45));
      iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)r,(secp256k1_ge *)psVar24);
      if (iVar7 == 0) goto LAB_00113e37;
      lVar45 = lVar45 + 0x68;
      puVar49 = puVar49 + 0x3a8;
      uVar11 = uVar11 + 9;
    } while (lVar45 != 0x548);
    r = (secp256k1_context *)auStack_10b0;
    secp256k1_ge_verify((secp256k1_ge *)r);
    if (aiStack_1058[2] == 0) goto LAB_00113e87;
    r = (secp256k1_context *)auStack_b60;
    secp256k1_gej_verify((secp256k1_gej *)r);
    if (auStack_b60._144_4_ == 0) goto LAB_00113e8c;
    lVar45 = 0xc;
    psVar48 = asStack_1048;
    a_01 = (secp256k1_context *)(auStack_b60 + 0x98);
    do {
      r = psVar48;
      secp256k1_ge_verify((secp256k1_ge *)psVar48);
      if ((psVar48->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00113e3c;
      r = a_01;
      secp256k1_gej_verify((secp256k1_gej *)a_01);
      if ((int)(a_01->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00113e41;
      a_01 = (secp256k1_context *)&(a_01->ecmult_gen_ctx).proj_blind.magnitude;
      psVar48 = (secp256k1_context *)&(psVar48->ecmult_gen_ctx).ge_offset.infinity;
      lVar45 = lVar45 + -1;
    } while (lVar45 != 0);
    pFVar27 = (FILE *)auStack_10b0;
    psStack_1e60 = (secp256k1_gej *)0x0;
    uStack_1e48 = 0;
    do {
      if (((ulong)num_cores == 1) ||
         (uStack_1e48 = uStack_1e48 + 0xe7037ed1a0b428db,
         (uint32_t)((uStack_1e48 >> 0x20 ^ uStack_1e48 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
         this_core)) {
        lVar45 = (long)psStack_1e60 * 0x98;
        secp256k1_fe_inv((secp256k1_fe *)auStack_1830,
                         (secp256k1_fe *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 0x60));
        lVar26 = 0;
        __stream = pFVar27;
        psVar24 = psStack_1e60;
        do {
          psVar13 = (secp256k1_ge *)(((ulong)psVar24 / 0xd) * -0x548 + (long)__stream);
          psVar33 = (secp256k1_gej *)(auStack_b60 + lVar26);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)(auStack_1590 + 0x60),psVar33,
                     (secp256k1_gej *)(auStack_b60 + (long)psStack_1e60 * 0x98),
                     (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar13);
          if (iVar7 == 0) goto LAB_00113dc2;
          if (psStack_1e60 != (secp256k1_gej *)0x0) {
            secp256k1_gej_add_ge
                      ((secp256k1_gej *)(auStack_1590 + 0x60),psVar33,
                       (secp256k1_ge *)(auStack_10b0 + (long)psStack_1e60 * 0x68));
            iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar13);
            if (iVar7 == 0) {
              main_cold_9();
              goto LAB_00113e07;
            }
          }
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)(auStack_1590 + 0x60),psVar33,
                     (secp256k1_ge *)(auStack_10b0 + (long)psStack_1e60 * 0x68),(secp256k1_fe *)0x0)
          ;
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar13);
          psStack_1e68 = psVar24;
          if (iVar7 == 0) goto LAB_00113dc7;
          iStack_1ad0 = *(int *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 0x90);
          auStack_1b30._32_8_ = *(uint64_t *)(auStack_b60 + lVar45 + 0x20);
          auStack_1b30._40_7_ = (undefined7)*(undefined8 *)(auStack_b60 + lVar45 + 0x28);
          auStack_1b30[0x2f] = (uchar)((ulong)*(undefined8 *)(auStack_b60 + lVar45 + 0x28) >> 0x38);
          auStack_1b30._16_8_ = *(uint64_t *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 0x10);
          auStack_1b30._24_7_ = (undefined7)*(undefined8 *)(auStack_b60 + lVar45 + 0x18);
          auStack_1b30[0x1f] = (uchar)((ulong)*(undefined8 *)(auStack_b60 + lVar45 + 0x18) >> 0x38);
          auStack_1b30._0_8_ =
               (((secp256k1_gej *)(auStack_b60 + (long)psStack_1e60 * 0x98))->x).n[0];
          auStack_1b30._8_7_ =
               (undefined7)*(undefined8 *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 8);
          auStack_1b30[0xf] =
               (uchar)((ulong)*(undefined8 *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 8) >> 0x38);
          auStack_1b30._48_8_ = *(undefined8 *)(auStack_b60 + lVar45 + 0x30);
          auStack_1af0 = *(undefined1 (*) [16])(auStack_b60 + lVar45 + 0x40);
          uStack_1ae0 = *(undefined4 *)(auStack_b60 + lVar45 + 0x50);
          uStack_1adc = *(undefined4 *)(auStack_b60 + lVar45 + 0x54);
          iStack_1ad8 = *(int *)(auStack_b60 + lVar45 + 0x58);
          iStack_1ad4 = *(int *)(auStack_b60 + lVar45 + 0x5c);
          auStack_1af8._0_7_ = (undefined7)*(undefined8 *)(auStack_b60 + lVar45 + 0x38);
          auStack_1af8[7] = (uchar)((ulong)*(undefined8 *)(auStack_b60 + lVar45 + 0x38) >> 0x38);
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)(auStack_1590 + 0x60),psVar33,(secp256k1_ge *)auStack_1b30,
                     (secp256k1_fe *)auStack_1830);
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar13);
          if (iVar7 == 0) goto LAB_00113dcc;
          lVar26 = lVar26 + 0x98;
          __stream = (FILE *)&__stream->_chain;
          psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + 1);
        } while (lVar26 != 0x7b8);
      }
      psVar48 = (secp256k1_context *)(auStack_1590 + 0x60);
      psStack_1e60 = (secp256k1_gej *)((long)(psStack_1e60->x).n + 1);
      pFVar27 = (FILE *)&pFVar27->_chain;
    } while (psStack_1e60 != (secp256k1_gej *)0xd);
    psVar24 = (secp256k1_gej *)auStack_b60;
    uVar23 = 0;
    uVar11 = 0;
    do {
      secp256k1_gej_double((secp256k1_gej *)psVar48,psVar24);
      uVar18 = uVar23 - 0xd;
      if (uVar11 < 7) {
        uVar18 = uVar23;
      }
      r = psVar48;
      iVar7 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)psVar48,
                         (secp256k1_ge *)(auStack_10b0 + (ulong)uVar18 * 0x68));
      if (iVar7 == 0) goto LAB_00113e46;
      secp256k1_gej_double_var((secp256k1_gej *)psVar48,psVar24,(secp256k1_fe *)0x0);
      r = psVar48;
      iVar7 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)psVar48,
                         (secp256k1_ge *)(auStack_10b0 + (ulong)uVar18 * 0x68));
      if (iVar7 == 0) goto LAB_00113e4b;
      uVar11 = uVar11 + 1;
      uVar23 = uVar23 + 2;
      psVar24 = psVar24 + 1;
    } while (uVar11 != 0xd);
    lVar45 = 0x68;
    psVar13 = &sStack_bd0;
    psVar24 = (secp256k1_gej *)(auStack_b60 + 0x98);
    do {
      r = (secp256k1_context *)auStack_1b30;
      secp256k1_ge_neg((secp256k1_ge *)r,(secp256k1_ge *)(auStack_10b0 + lVar45));
      iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)r,psVar13);
      if (iVar7 == 0) goto LAB_00113e50;
      secp256k1_gej_neg((secp256k1_gej *)psVar48,psVar24);
      r = psVar48;
      iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar48,psVar13);
      if (iVar7 == 0) goto LAB_00113e55;
      lVar45 = lVar45 + 0x68;
      psVar24 = psVar24 + 1;
      psVar13 = psVar13 + -1;
    } while (lVar45 != 0x548);
    lVar45 = 1;
    psStack_1e58 = (secp256k1_scalar *)0x68;
    uStack_1e48 = 0;
    do {
      psStack_1e68 = (secp256k1_gej *)0x0;
      pFVar27 = (FILE *)auStack_10b0;
      do {
        if (((ulong)num_cores == 1) ||
           (uStack_1e48 = uStack_1e48 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1e48 >> 0x20 ^ uStack_1e48 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          uVar23 = 0;
          __stream = pFVar27;
          psVar24 = psStack_1e68;
          do {
            auStack_1db0._0_4_ = uVar23;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
            auStack_1de0._0_4_ = (int)psStack_1e68;
            secp256k1_scalar_verify((secp256k1_scalar *)psStack_1e68);
            auStack_1e20._8_8_ = auStack_1b30;
            auStack_1e20._0_8_ = auStack_1830;
            auStack_1e10._0_8_ = auStack_1590 + 0x60;
            na = (code *)auStack_1db0;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1e20,(secp256k1_gej *)auStack_1cd0,1,
                       (secp256k1_gej *)(auStack_b60 + lVar45 * 0x98),(secp256k1_scalar *)na,
                       (secp256k1_scalar *)auStack_1de0);
            iVar7 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1cd0,
                               (secp256k1_ge *)(((ulong)psVar24 / 0xd) * -0x548 + (long)__stream));
            if (iVar7 == 0) {
              main_cold_56();
              goto LAB_00113dc2;
            }
            uVar23 = uVar23 + 1;
            __stream = (FILE *)((long)&__stream->_flags + (long)psStack_1e58);
            psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + lVar45);
          } while (uVar23 != 0xd);
        }
        psVar48 = (secp256k1_context *)(auStack_1590 + 0x60);
        psStack_1e68 = (secp256k1_gej *)((long)(psStack_1e68->x).n + 1);
        pFVar27 = (FILE *)&pFVar27->_chain;
      } while ((int)psStack_1e68 != 0xd);
      lVar45 = lVar45 + 1;
      psStack_1e58 = (secp256k1_scalar *)((long)psStack_1e58 + 0x68);
    } while (lVar45 != 0xd);
    uVar11 = 0;
    do {
      lVar45 = 0;
      do {
        if (((ulong)num_cores == 1) ||
           (uStack_1e48 = uStack_1e48 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1e48 >> 0x20 ^ uStack_1e48 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          auStack_1e20._0_4_ = (int)uVar11;
          secp256k1_scalar_verify((secp256k1_scalar *)(uVar11 & 0xffffffff));
          psVar13 = (secp256k1_ge *)(auStack_10b0 + lVar45 * 0x68);
          secp256k1_ecmult_const((secp256k1_gej *)psVar48,psVar13,(secp256k1_scalar *)auStack_1e20);
          uVar23 = (int)lVar45 * (int)uVar11;
          psVar37 = (secp256k1_ge *)
                    (auStack_10b0 + (ulong)(uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc)) * 0x68);
          r = psVar48;
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar48,psVar37);
          if (iVar7 == 0) goto LAB_00113e5f;
          if (lVar45 != 0 && uVar11 != 0) {
            r = (secp256k1_context *)auStack_1cd0;
            iVar7 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)psVar13,
                               (secp256k1_fe *)0x0,(secp256k1_scalar *)auStack_1e20,0);
            if (iVar7 == 0) goto LAB_00113e6e;
            r = (secp256k1_context *)auStack_1cd0;
            iVar7 = secp256k1_fe_equal((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)psVar37);
            if (iVar7 == 0) goto LAB_00113e73;
            do {
              testutil_random_fe((secp256k1_fe *)auStack_1830);
              r = (secp256k1_context *)auStack_1830;
              secp256k1_fe_verify((secp256k1_fe *)auStack_1830);
              if (iStack_1804 == 0) goto LAB_00113e1e;
            } while ((SUB168(auStack_1820 | auStack_1830,8) == 0 &&
                     SUB168(auStack_1820 | auStack_1830,0) == 0) &&
                     CONCAT44(auStack_180c,auStack_1810) == 0);
            secp256k1_fe_mul((secp256k1_fe *)auStack_1b30,(secp256k1_fe *)auStack_1830,
                             (secp256k1_fe *)psVar13);
            na = (code *)0x0;
            r = (secp256k1_context *)auStack_1cd0;
            iVar7 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)auStack_1b30,
                               (secp256k1_fe *)auStack_1830,(secp256k1_scalar *)auStack_1e20,0);
            if (iVar7 == 0) goto LAB_00113e78;
            r = (secp256k1_context *)auStack_1cd0;
            iVar7 = secp256k1_fe_equal((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)psVar37);
            if (iVar7 == 0) goto LAB_00113e7d;
          }
        }
        lVar45 = lVar45 + 1;
      } while (lVar45 != 0xd);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0xd);
    psStack_1d68 = &psVar14->error_callback;
    scratch = secp256k1_scratch_create(psStack_1d68,0x1000);
    p_Stack_1d80 = (_func_void_char_ptr_void_ptr *)0x0;
    uStack_1d58 = 0;
    psStack_1d50 = scratch;
    do {
      p_Stack_1d70 = (_func_void_char_ptr_void_ptr *)0x0;
      do {
        psStack_1d78 = (secp256k1_scalar *)0x0;
        do {
          uVar38 = 0;
          do {
            if (((ulong)num_cores == 1) ||
               (uStack_1d58 = uStack_1d58 + 0xe7037ed1a0b428db,
               (uint32_t)
               ((uStack_1d58 >> 0x20 ^ uStack_1d58 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
               this_core)) {
              p_Stack_1d10 = (_func_void_char_ptr_void_ptr *)(auStack_10b0 + uVar38 * 0x68);
              psStack_1d18 = (secp256k1_scalar *)(uVar38 * (long)p_Stack_1d80 + (long)psStack_1d78);
              uVar28 = 0;
              uStack_1d20 = uVar38;
              do {
                asStack_1530[0].ecmult_gen_ctx.built = (int)p_Stack_1d80;
                secp256k1_scalar_verify((secp256k1_scalar *)p_Stack_1d80);
                asStack_1530[0].ecmult_gen_ctx.scalar_offset = (int)p_Stack_1d70;
                secp256k1_scalar_verify((secp256k1_scalar *)p_Stack_1d70);
                auStack_1db0._0_4_ = (int)psStack_1d78;
                secp256k1_scalar_verify(psStack_1d78);
                p_Var34 = p_Stack_1d10;
                psVar13 = &asStack_1530[0].ecmult_gen_ctx.ge_offset;
                for (lVar45 = 0xd; lVar45 != 0; lVar45 = lVar45 + -1) {
                  (psVar13->x).n[0] = *(undefined8 *)p_Var34;
                  p_Var34 = p_Var34 + (ulong)bVar54 * -0x10 + 8;
                  psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar54 * -2 + 1) * 8);
                }
                puVar35 = (uint64_t *)(auStack_10b0 + uVar28 * 0x68);
                psVar42 = &asStack_1530[0].ecmult_gen_ctx.proj_blind;
                for (pvVar20 = (void *)0xd; pvVar20 != (void *)0x0;
                    pvVar20 = (void *)((long)pvVar20 + -1)) {
                  psVar42->n[0] = *puVar35;
                  puVar35 = puVar35 + (ulong)bVar54 * -2 + 1;
                  psVar42 = (secp256k1_fe *)((long)psVar42 + ((ulong)bVar54 * -2 + 1) * 8);
                }
                secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1830);
                if (scratch == (secp256k1_scratch *)0x0) {
LAB_001126b3:
                  secp256k1_ecmult_multi_simple_var
                            ((secp256k1_gej *)auStack_1830,(secp256k1_scalar *)auStack_1db0,
                             (secp256k1_ecmult_multi_callback *)(auStack_1590 + 0x60),pvVar20,
                             (size_t)na);
                }
                else {
                  lVar45 = 0;
                  do {
                    if (scratch->magic[lVar45] != "scratch"[lVar45]) {
                      (*(psVar14->error_callback).fn)
                                ("invalid scratch space",(psVar14->error_callback).data);
                      uVar11 = 0;
                      goto LAB_001122fc;
                    }
                    lVar45 = lVar45 + 1;
                  } while (lVar45 != 8);
                  uVar21 = scratch->max_size - scratch->alloc_size;
                  uVar11 = 0;
                  if (0x59 < uVar21) {
                    uVar11 = uVar21 - 0x5a;
                  }
LAB_001122fc:
                  pvVar20 = (void *)0x1;
                  na = (code *)&DAT_00121660;
                  uVar21 = 0;
                  do {
                    if (pvVar20 == (void *)0xd) break;
                    if (pvVar20 < (void *)0xd) {
                      uVar38 = (((secp256k1_gej *)na)->x).n[0];
                    }
                    else {
                      uVar38 = 0;
                    }
                    uVar31 = (ulong)(byte)(0x7f / (byte)((byte)pvVar20 + 1));
                    uVar36 = (0x98L << ((byte)pvVar20 & 0x3f)) + uVar31 * 8 + 0x118;
                    if (uVar11 < uVar36) break;
                    uVar36 = (uVar11 - uVar36) / (uVar31 * 8 + 0x108);
                    uVar31 = uVar36;
                    if (uVar38 <= uVar36) {
                      uVar31 = uVar38;
                    }
                    if (uVar21 < uVar31) {
                      uVar21 = uVar31;
                    }
                    na = (code *)((((secp256k1_gej *)na)->x).n + 1);
                    pvVar20 = (void *)((long)pvVar20 + 1);
                  } while (uVar38 <= uVar36);
                  if (uVar21 == 0) goto LAB_001126b3;
                  lVar45 = 0;
                  do {
                    pvVar20 = (void *)CONCAT71((int7)((ulong)pvVar20 >> 8),scratch->magic[lVar45]);
                    if (scratch->magic[lVar45] != "scratch"[lVar45]) {
                      (*(psVar14->error_callback).fn)
                                ("invalid scratch space",(psVar14->error_callback).data);
                      goto LAB_001126b3;
                    }
                    lVar45 = lVar45 + 1;
                  } while (lVar45 != 8);
                  uVar11 = scratch->max_size - scratch->alloc_size;
                  pvVar20 = (void *)0x0;
                  if (0x4a < uVar11) {
                    pvVar20 = (void *)(uVar11 - 0x4b);
                  }
                  if (pvVar20 < (void *)0x70c) goto LAB_001126b3;
                  p_Stack_1d00 = (_func_void_char_ptr_void_ptr *)((long)pvVar20 - 0xe18);
                  psStack_1cf0 = (secp256k1_gej *)
                                 (ulong)(p_Stack_1d00 <
                                        (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f4);
                  puStack_1cf8 = (undefined1 *)((long)(psStack_1cf0->x).n + 1);
                  puVar49 = (undefined1 *)0x2;
                  bVar4 = 0;
                  psStack_1e40 = (secp256k1_scalar *)auStack_1db0;
                  lVar45 = 0;
                  uStack_1d48 = uVar28;
                  do {
                    puVar30 = puStack_1cf8;
                    if (puVar49 < puStack_1cf8) {
                      puVar30 = puVar49;
                    }
                    lVar45 = lVar45 << ((byte)psStack_1cf0 & 0x3f);
                    lVar26 = 0;
                    psVar24 = psStack_1cf0;
                    do {
                      psVar24 = (secp256k1_gej *)
                                CONCAT71((int7)((ulong)psVar24 >> 8),scratch->magic[lVar26]);
                      if (scratch->magic[lVar26] != "scratch"[lVar26]) {
                        (*(psVar14->error_callback).fn)
                                  ("invalid scratch space",(psVar14->error_callback).data);
                        sStack_1e28 = 0;
                        psVar33 = (secp256k1_gej *)na;
                        goto LAB_00112476;
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 8);
                    sStack_1e28 = scratch->alloc_size;
                    psVar33 = (secp256k1_gej *)na;
LAB_00112476:
                    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1b30);
                    error_callback = psStack_1d68;
                    na = (code *)psVar33;
                    if (puVar49 != (undefined1 *)0x0 || psStack_1e40 != (secp256k1_scalar *)0x0) {
                      psStack_1e30 = (secp256k1_gej *)
                                     secp256k1_scratch_alloc
                                               (psStack_1d68,scratch,(long)puVar30 * 0x98);
                      uVar17 = SUB84(psVar24,0);
                      psStack_1d08 = (secp256k1_gej *)
                                     secp256k1_scratch_alloc
                                               (error_callback,scratch,(long)puVar30 * 4);
                      pvVar20 = secp256k1_scratch_alloc(error_callback,scratch,(long)puVar30 * 0xc0)
                      ;
                      auStack_1e20._0_8_ = pvVar20;
                      pvVar15 = secp256k1_scratch_alloc
                                          (error_callback,scratch,(long)puVar30 * 0x1a0);
                      auStack_1e20._8_8_ = pvVar15;
                      pvVar16 = secp256k1_scratch_alloc
                                          (error_callback,scratch,(long)puVar30 * 0x410);
                      na = (code *)psStack_1d08;
                      scratch = psStack_1d50;
                      auStack_1e10._0_8_ = pvVar16;
                      auVar55._0_4_ =
                           -(uint)((int)psStack_1e30 == 0 && (int)((ulong)psStack_1e30 >> 0x20) == 0
                                  );
                      auVar55._4_4_ =
                           -(uint)((int)psStack_1d08 == 0 && (int)((ulong)psStack_1d08 >> 0x20) == 0
                                  );
                      auVar55._8_4_ =
                           -(uint)((int)pvVar20 == 0 && (int)((ulong)pvVar20 >> 0x20) == 0);
                      auVar55._12_4_ =
                           -(uint)((int)pvVar15 == 0 && (int)((ulong)pvVar15 >> 0x20) == 0);
                      iVar7 = movmskps(uVar17,auVar55);
                      if ((iVar7 != 0) || (pvVar16 == (void *)0x0)) {
                        secp256k1_scratch_apply_checkpoint(psStack_1d68,psStack_1d50,sStack_1e28);
                        uVar28 = uStack_1d48;
                        na = (code *)psVar33;
                        break;
                      }
                      if (puVar49 != (undefined1 *)0x0) {
                        psVar42 = &(&asStack_1530[0].ecmult_gen_ctx.ge_offset)[lVar45].x;
                        puVar50 = (undefined1 *)0x0;
                        psVar24 = psStack_1e30;
                        do {
                          *(undefined4 *)((long)(((secp256k1_gej *)na)->x).n + (long)puVar50 * 4) =
                               *(undefined4 *)(auStack_1590 + (long)puVar50 * 4 + lVar45 * 4 + 0x60)
                          ;
                          psVar43 = psVar42;
                          psVar13 = (secp256k1_ge *)auStack_1cd0;
                          for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
                            (psVar13->x).n[0] = psVar43->n[0];
                            psVar43 = (secp256k1_fe *)((long)psVar43 + ((ulong)bVar54 * -2 + 1) * 8)
                            ;
                            psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar54 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar24,(secp256k1_ge *)auStack_1cd0);
                          puVar50 = puVar50 + 1;
                          psVar24 = psVar24 + 1;
                          psVar42 = (secp256k1_fe *)((long)(psVar42 + 2) + 8);
                        } while (puVar30 != puVar50);
                      }
                      psVar24 = psStack_1e30;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1e20,
                                 (secp256k1_gej *)auStack_1b30,(size_t)puVar30,psStack_1e30,
                                 (secp256k1_scalar *)na,psStack_1e40);
                      scratch = psStack_1d50;
                      secp256k1_scratch_apply_checkpoint(psStack_1d68,psStack_1d50,sStack_1e28);
                    }
                    bVar53 = (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f3 < p_Stack_1d00;
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_1830,(secp256k1_gej *)auStack_1830,
                               (secp256k1_gej *)auStack_1b30,&psVar24->x);
                    puVar49 = puVar49 + -(long)puVar30;
                    bVar6 = bVar4 ^ 1;
                    lVar45 = 1;
                    psStack_1e40 = (secp256k1_scalar *)0x0;
                    bVar4 = 1;
                    uVar28 = uStack_1d48;
                  } while ((bool)(bVar53 & bVar6));
                }
                r = (secp256k1_context *)auStack_1830;
                uVar23 = (int)uVar28 * (int)p_Stack_1d70 + (int)psStack_1d18;
                iVar7 = secp256k1_gej_eq_ge_var
                                  ((secp256k1_gej *)r,
                                   (secp256k1_ge *)
                                   (auStack_10b0 +
                                   (ulong)(uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc)) * 0x68));
                if (iVar7 == 0) goto LAB_00113e5a;
                uVar28 = uVar28 + 1;
                uVar38 = uStack_1d20;
              } while (uVar28 != 0xd);
            }
            uVar38 = uVar38 + 1;
          } while (uVar38 != 0xd);
          psStack_1d78 = (secp256k1_scalar *)((long)psStack_1d78 + 1);
        } while (psStack_1d78 != (secp256k1_scalar *)0xd);
        p_Stack_1d70 = p_Stack_1d70 + 1;
      } while (p_Stack_1d70 != (_func_void_char_ptr_void_ptr *)0xd);
      p_Stack_1d80 = p_Stack_1d80 + 1;
    } while (p_Stack_1d80 != (_func_void_char_ptr_void_ptr *)0xd);
    secp256k1_scratch_destroy(psStack_1d68,scratch);
    psVar46 = (secp256k1_scalar *)0x1;
    uVar11 = 0;
    do {
      r_00 = (secp256k1_scalar *)0x1;
      do {
        if (((ulong)num_cores == 1) ||
           (uVar11 = uVar11 + 0xe7037ed1a0b428db,
           (uint32_t)((uVar11 >> 0x20 ^ uVar11 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
           this_core)) {
          auStack_1cd0._0_4_ = 1;
          iVar7 = 1;
          do {
            secp256k1_scalar_verify(psVar46);
            secp256k1_scalar_verify(r_00);
            secp256k1_scalar_verify(r_00);
            auStack_1b30._16_8_ = 0;
            auStack_1b30[0x18] = '\0';
            auStack_1b30[0x19] = '\0';
            auStack_1b30[0x1a] = '\0';
            auStack_1b30[0x1b] = '\0';
            auStack_1b30[0x1c] = '\0';
            auStack_1b30[0x1d] = '\0';
            auStack_1b30[0x1e] = '\0';
            auStack_1b30._0_8_ = 0;
            auStack_1b30[8] = '\0';
            auStack_1b30[9] = '\0';
            auStack_1b30[10] = '\0';
            auStack_1b30[0xb] = '\0';
            auStack_1b30[0xc] = '\0';
            auStack_1b30[0xd] = '\0';
            auStack_1b30[0xe] = '\0';
            auStack_1b30[0xf] = '\0';
            auStack_1b30[0x1f] = (uchar)r_00;
            secp256k1_scalar_verify(psVar46);
            auStack_1830 = (undefined1  [16])0x0;
            auStack_1820._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1820[0xf] = (char)psVar46;
            na = secp256k1_nonce_function_smallint;
            r = psVar14;
            iVar8 = secp256k1_ecdsa_sign
                              (psVar14,(secp256k1_ecdsa_signature *)(auStack_1590 + 0x60),
                               auStack_1830,auStack_1b30,secp256k1_nonce_function_smallint,
                               auStack_1cd0);
            if (iVar8 != 1) goto LAB_00113ea0;
            lVar45 = 0;
            uVar23 = 0;
            do {
              uVar18 = (uint)(byte)auStack_1590[lVar45 + 0x60] | uVar23 << 8;
              uVar23 = uVar18 - (uVar18 / 0xd + (uVar18 / 0xd) * 0xc);
              if (uVar18 < 0xd) {
                uVar23 = uVar18;
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
            uVar18 = 0;
            lVar45 = 0x20;
            do {
              uVar19 = (uint)(byte)auStack_1590[lVar45 + 0x60] | uVar18 << 8;
              uVar18 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
              if (uVar19 < 0xd) {
                uVar18 = uVar19;
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
            r = (secp256k1_context *)auStack_1e20;
            r_from_k((secp256k1_scalar *)r,(secp256k1_ge *)auStack_10b0,auStack_1cd0._0_4_,
                     (int *)0x0);
            if (uVar23 != auStack_1e20._0_4_) goto LAB_00113ea5;
            uVar17 = auStack_1cd0._0_4_;
            uVar19 = auStack_1cd0._0_4_ * uVar18;
            uVar23 = uVar23 * (int)r_00 + (int)psVar46;
            iVar8 = uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc);
            if ((uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) != iVar8) &&
               (uVar23 = (0xd - uVar18) * auStack_1cd0._0_4_,
               uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc) != iVar8)) goto LAB_00113eaa;
            if ((int)auStack_1cd0._0_4_ < iVar7) break;
            iVar7 = auStack_1cd0._0_4_ + 1;
            auStack_1cd0._0_4_ = iVar7;
          } while ((int)uVar17 < 0xc);
        }
        uVar23 = (int)r_00 + 1;
        r_00 = (secp256k1_scalar *)(ulong)uVar23;
      } while (uVar23 != 0xd);
      uVar23 = (int)psVar46 + 1;
      psVar46 = (secp256k1_scalar *)(ulong)uVar23;
    } while (uVar23 != 0xd);
    uVar23 = 1;
    psStack_1e30 = (secp256k1_gej *)0x0;
    uVar9 = num_cores;
    do {
      psStack_1e68 = (secp256k1_gej *)0x1;
      do {
        uVar18 = 1;
        do {
          psStack_1e60 = (secp256k1_gej *)0x1;
          do {
            if ((uVar9 == 1) ||
               (psStack_1e30 = (secp256k1_gej *)((long)psStack_1e30[-0x2a150f76858d35].y.n + 0x23),
               (uint32_t)
               ((ulong)uVar9 * ((ulong)psStack_1e30 >> 0x20 ^ (ulong)psStack_1e30 & 0xffffffff) >>
               0x20) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1e20._0_4_ = uVar18;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e60 & 0xffffffff));
              uVar40 = (int)psStack_1e68 * (int)psStack_1e60;
              uVar40 = uVar40 - (uVar40 / 0xd + (uVar40 / 0xd) * 0xc);
              uVar11 = 0;
              uVar19 = 0;
              uVar29 = 0;
              do {
                r_from_k((secp256k1_scalar *)(auStack_1590 + 0x60),(secp256k1_ge *)auStack_10b0,
                         uVar29,(int *)0x0);
                if (psStack_1e68 ==
                    (secp256k1_gej *)(asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                  uVar47 = (int)uVar11 - ((int)(uVar11 / 0xd) + (int)(uVar11 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar47);
                  secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1e60);
                  auStack_1db0._0_4_ = uVar40;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar40);
                  secp256k1_scalar_add
                            ((secp256k1_scalar *)auStack_1db0,(secp256k1_scalar *)auStack_1db0,
                             (secp256k1_scalar *)auStack_1e20);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar47);
                  uVar17 = auStack_1db0._0_4_;
                  secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1db0._0_8_ & 0xffffffff));
                  uVar19 = uVar19 | uVar47 == uVar17;
                }
                uVar29 = uVar29 + 1;
                uVar11 = (ulong)((int)uVar11 + uVar23);
              } while (uVar29 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1b30._16_8_ = 0;
              auStack_1b30[0x18] = '\0';
              auStack_1b30[0x19] = '\0';
              auStack_1b30[0x1a] = '\0';
              auStack_1b30[0x1b] = '\0';
              auStack_1b30[0x1c] = '\0';
              auStack_1b30[0x1d] = '\0';
              auStack_1b30[0x1e] = '\0';
              auStack_1b30._0_8_ = 0;
              auStack_1b30[8] = '\0';
              auStack_1b30[9] = '\0';
              auStack_1b30[10] = '\0';
              auStack_1b30[0xb] = '\0';
              auStack_1b30[0xc] = '\0';
              auStack_1b30[0xd] = '\0';
              auStack_1b30[0xe] = '\0';
              auStack_1b30[0xf] = '\0';
              auStack_1b30[0x1f] = (uchar)psStack_1e68;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
              auStack_1b30._48_8_ = 0;
              auStack_1af8[0] = '\0';
              auStack_1af8[1] = '\0';
              auStack_1af8[2] = '\0';
              auStack_1af8[3] = '\0';
              auStack_1af8[4] = '\0';
              auStack_1af8[5] = '\0';
              auStack_1af8[6] = '\0';
              auStack_1b30._32_8_ = 0;
              auStack_1b30._40_7_ = 0;
              auStack_1b30[0x2f] = '\0';
              auStack_1af8[7] = (uchar)uVar23;
              puVar35 = (uint64_t *)(auStack_10b0 + (long)psStack_1e60 * 0x68);
              psVar13 = (secp256k1_ge *)(auStack_1590 + 0x60);
              for (lVar45 = 0xd; lVar45 != 0; lVar45 = lVar45 + -1) {
                (psVar13->x).n[0] = *puVar35;
                puVar35 = puVar35 + (ulong)bVar54 * -2 + 1;
                psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar54 * -0x10 + 8);
              }
              secp256k1_pubkey_save
                        ((secp256k1_pubkey *)auStack_1830,(secp256k1_ge *)(auStack_1590 + 0x60));
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              auStack_1cd0 = (undefined1  [16])0x0;
              auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
              auStack_1cc0[0xf] = (char)uVar18;
              r = psVar14;
              uVar29 = secp256k1_ecdsa_verify
                                 (psVar14,(secp256k1_ecdsa_signature *)auStack_1b30,auStack_1cd0,
                                  (secp256k1_pubkey *)auStack_1830);
              uVar9 = num_cores;
              if ((uVar23 < 7 & uVar19) != uVar29) goto LAB_00113eaf;
            }
            psStack_1e60 = (secp256k1_gej *)((long)psStack_1e60 + 1);
          } while (psStack_1e60 != (secp256k1_gej *)0xd);
          uVar18 = uVar18 + 1;
        } while (uVar18 != 0xd);
        psStack_1e68 = (secp256k1_gej *)((long)psStack_1e68 + 1);
      } while (psStack_1e68 != (secp256k1_gej *)0xd);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 0xd);
    uVar23 = 1;
    psStack_1e58 = (secp256k1_scalar *)0x0;
    do {
      psVar46 = (secp256k1_scalar *)0x1;
      do {
        iVar7 = (int)psVar46;
        if (((ulong)num_cores == 1) ||
           (psStack_1e58 = (secp256k1_scalar *)((long)psStack_1e58 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1e58 >> 0x20 ^ (ulong)psStack_1e58 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          auStack_1db0._0_4_ = 1;
          iVar8 = 1;
          do {
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
            secp256k1_scalar_verify(psVar46);
            secp256k1_scalar_verify(psVar46);
            auStack_1cd0 = (undefined1  [16])0x0;
            auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1cc0[0xf] = (char)psVar46;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
            auStack_1e20 = (undefined1  [16])0x0;
            auStack_1e10._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1e10[0xf] = (char)uVar23;
            na = secp256k1_nonce_function_smallint;
            secp256k1_ecdsa_sign_recoverable
                      (psVar14,(secp256k1_ecdsa_recoverable_signature *)(auStack_1590 + 0x60),
                       auStack_1e20,auStack_1cd0,secp256k1_nonce_function_smallint,auStack_1db0);
            lVar45 = 0;
            uVar18 = 0;
            do {
              uVar19 = (uint)(byte)auStack_1590[lVar45 + 0x60] | uVar18 << 8;
              uVar18 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
              if (uVar19 < 0xd) {
                uVar18 = uVar19;
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
            uVar19 = 0;
            lVar45 = 0x20;
            do {
              uVar29 = (uint)(byte)auStack_1590[lVar45 + 0x60] | uVar19 << 8;
              uVar19 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
              if (uVar29 < 0xd) {
                uVar19 = uVar29;
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            bVar4 = (byte)asStack_1530[0].ecmult_gen_ctx.ge_offset.y.n[1];
            r = (secp256k1_context *)auStack_1de0;
            r_from_k((secp256k1_scalar *)r,(secp256k1_ge *)auStack_10b0,auStack_1db0._0_4_,
                     (int *)&sStack_1d40);
            if (uVar18 != auStack_1de0._0_4_) goto LAB_00113eb4;
            lVar45 = (long)(int)auStack_1db0._0_4_;
            uVar29 = auStack_1db0._0_4_ * uVar19;
            uVar18 = uVar18 * iVar7 + uVar23;
            iVar41 = uVar18 - (uVar18 / 0xd + (uVar18 / 0xd) * 0xc);
            if ((uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar41) &&
               (uVar18 = (0xd - uVar19) * auStack_1db0._0_4_,
               uVar18 - (uVar18 / 0xd + (uVar18 / 0xd) * 0xc) != iVar41)) goto LAB_00113eb9;
            uVar18 = (uint)((uint)sStack_1d40.fn != 0) * 2;
            lVar26 = lVar45 * 0x68;
            auStack_1810 = *(uchar (*) [4])(auStack_1060 + lVar26);
            auStack_180c = *(uchar (*) [4])(auStack_105c + lVar26);
            iStack_1808 = aiStack_1058[lVar45 * 0x1a];
            iStack_1804 = aiStack_1058[lVar45 * 0x1a + 1];
            auStack_1830._8_8_ = auStack_1078[lVar45 * 0xd];
            auStack_1830._0_8_ = (&uStack_1080)[lVar45 * 0xd];
            auStack_1820._8_8_ = *(undefined8 *)(auStack_1060 + lVar26 + -8);
            auStack_1820._0_8_ = auStack_1078[lVar45 * 0xd + 1];
            r = (secp256k1_context *)auStack_1830;
            secp256k1_fe_normalize((secp256k1_fe *)r);
            uVar19 = uVar19 * auStack_1db0._0_4_;
            secp256k1_fe_verify((secp256k1_fe *)r);
            if (uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) == iVar41) {
              if (iStack_1804 == 0) goto LAB_00113ebe;
              uVar18 = auStack_1830._0_4_ & 1 | uVar18;
            }
            else {
              if (iStack_1804 == 0) goto LAB_00113ec3;
              uVar18 = (auStack_1830._0_4_ & 1 | uVar18) ^ 1;
            }
            if (uVar18 != bVar4) goto LAB_00113ec8;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psVar14,(secp256k1_ecdsa_signature *)auStack_1b30,
                       (secp256k1_ecdsa_recoverable_signature *)(auStack_1590 + 0x60));
            lVar45 = 0;
            uVar18 = 0;
            do {
              uVar19 = (uint)(byte)auStack_1b30[lVar45] | uVar18 << 8;
              uVar18 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
              if (uVar19 < 0xd) {
                uVar18 = uVar19;
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
            uVar19 = 0;
            lVar45 = 0x20;
            do {
              uVar29 = (uint)(byte)auStack_1b30[lVar45] | uVar19 << 8;
              uVar19 = uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc);
              if (uVar29 < 0xd) {
                uVar19 = uVar29;
              }
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            r = (secp256k1_context *)auStack_1de0;
            r_from_k((secp256k1_scalar *)r,(secp256k1_ge *)auStack_10b0,auStack_1db0._0_4_,
                     (int *)0x0);
            if (uVar18 != auStack_1de0._0_4_) goto LAB_00113ecd;
            uVar17 = auStack_1db0._0_4_;
            uVar29 = auStack_1db0._0_4_ * uVar19;
            uVar18 = uVar18 * iVar7 + uVar23;
            iVar41 = uVar18 - (uVar18 / 0xd + (uVar18 / 0xd) * 0xc);
            if ((uVar29 - (uVar29 / 0xd + (uVar29 / 0xd) * 0xc) != iVar41) &&
               (uVar18 = (0xd - uVar19) * auStack_1db0._0_4_,
               uVar18 - (uVar18 / 0xd + (uVar18 / 0xd) * 0xc) != iVar41)) goto LAB_00113ed2;
            if ((int)auStack_1db0._0_4_ < iVar8) break;
            iVar8 = auStack_1db0._0_4_ + 1;
            auStack_1db0._0_4_ = iVar8;
          } while ((int)uVar17 < 0xc);
        }
        psVar46 = (secp256k1_scalar *)(ulong)(iVar7 + 1U);
      } while (iVar7 + 1U != 0xd);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 0xd);
    uVar23 = 1;
    psStack_1e40 = (secp256k1_scalar *)0x0;
    uVar9 = num_cores;
    do {
      psStack_1e68 = (secp256k1_gej *)0x1;
      do {
        uVar18 = 1;
        do {
          psStack_1e58 = (secp256k1_scalar *)0x1;
          do {
            if ((uVar9 == 1) ||
               (psStack_1e40 = (secp256k1_scalar *)((long)psStack_1e40 + 0xe7037ed1a0b428db),
               (uint32_t)
               ((ulong)uVar9 * ((ulong)psStack_1e40 >> 0x20 ^ (ulong)psStack_1e40 & 0xffffffff) >>
               0x20) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1db0._0_4_ = uVar18;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e58 & 0xffffffff));
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              auStack_1e20 = (undefined1  [16])0x0;
              auStack_1e10._0_15_ = SUB1615((undefined1  [16])0x0,0);
              auStack_1e10[0xf] = (char)uVar18;
              uVar40 = (int)psStack_1e68 * (int)psStack_1e58;
              uVar40 = uVar40 - (uVar40 / 0xd + (uVar40 / 0xd) * 0xc);
              uVar11 = 0;
              uVar19 = 0;
              uVar29 = 0;
              do {
                r_from_k((secp256k1_scalar *)(auStack_1590 + 0x60),(secp256k1_ge *)auStack_10b0,
                         uVar29,(int *)0x0);
                if (psStack_1e68 ==
                    (secp256k1_gej *)(asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                  uVar47 = (int)uVar11 - ((int)(uVar11 / 0xd) + (int)(uVar11 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar29);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar47);
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1e68);
                  secp256k1_scalar_verify(psStack_1e58);
                  auStack_1de0._0_4_ = uVar40;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar40);
                  secp256k1_scalar_add
                            ((secp256k1_scalar *)auStack_1de0,(secp256k1_scalar *)auStack_1de0,
                             (secp256k1_scalar *)auStack_1db0);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar47);
                  uVar17 = auStack_1de0._0_4_;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)auStack_1de0._0_4_);
                  uVar19 = uVar19 | uVar47 == uVar17;
                }
                uVar29 = uVar29 + 1;
                uVar11 = (ulong)((int)uVar11 + uVar23);
              } while (uVar29 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1b30._16_8_ = 0;
              auStack_1b30[0x18] = '\0';
              auStack_1b30[0x19] = '\0';
              auStack_1b30[0x1a] = '\0';
              auStack_1b30[0x1b] = '\0';
              auStack_1b30[0x1c] = '\0';
              auStack_1b30[0x1d] = '\0';
              auStack_1b30[0x1e] = '\0';
              auStack_1b30._0_8_ = 0;
              auStack_1b30[8] = '\0';
              auStack_1b30[9] = '\0';
              auStack_1b30[10] = '\0';
              auStack_1b30[0xb] = '\0';
              auStack_1b30[0xc] = '\0';
              auStack_1b30[0xd] = '\0';
              auStack_1b30[0xe] = '\0';
              auStack_1b30[0xf] = '\0';
              auStack_1b30[0x1f] = (uchar)psStack_1e68;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
              auStack_1b30._48_8_ = 0;
              auStack_1af8[0] = '\0';
              auStack_1af8[1] = '\0';
              auStack_1af8[2] = '\0';
              auStack_1af8[3] = '\0';
              auStack_1af8[4] = '\0';
              auStack_1af8[5] = '\0';
              auStack_1af8[6] = '\0';
              auStack_1b30._32_8_ = 0;
              auStack_1b30._40_7_ = 0;
              auStack_1b30[0x2f] = '\0';
              auStack_1af8[7] = (uchar)uVar23;
              auVar3[0xf] = 0;
              auVar3._0_15_ = auStack_1af0._1_15_;
              auStack_1af0 = auVar3 << 8;
              secp256k1_ecdsa_recoverable_signature_convert
                        (psVar14,(secp256k1_ecdsa_signature *)auStack_1830,
                         (secp256k1_ecdsa_recoverable_signature *)auStack_1b30);
              puVar35 = (uint64_t *)(auStack_10b0 + (long)psStack_1e58 * 0x68);
              psVar13 = (secp256k1_ge *)(auStack_1590 + 0x60);
              for (lVar45 = 0xd; lVar45 != 0; lVar45 = lVar45 + -1) {
                (psVar13->x).n[0] = *puVar35;
                puVar35 = puVar35 + (ulong)bVar54 * -2 + 1;
                psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar54 * -0x10 + 8);
              }
              secp256k1_pubkey_save
                        ((secp256k1_pubkey *)auStack_1cd0,(secp256k1_ge *)(auStack_1590 + 0x60));
              r = psVar14;
              uVar29 = secp256k1_ecdsa_verify
                                 (psVar14,(secp256k1_ecdsa_signature *)auStack_1830,auStack_1e20,
                                  (secp256k1_pubkey *)auStack_1cd0);
              uVar9 = num_cores;
              if ((uVar23 < 7 & uVar19) != uVar29) goto LAB_00113ed7;
            }
            psStack_1e58 = (secp256k1_scalar *)((long)psStack_1e58 + 1);
          } while (psStack_1e58 != (secp256k1_scalar *)0xd);
          uVar18 = uVar18 + 1;
        } while (uVar18 != 0xd);
        psStack_1e68 = (secp256k1_gej *)((long)psStack_1e68 + 1);
      } while (psStack_1e68 != (secp256k1_gej *)0xd);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 0xd);
    uVar11 = 1;
    puVar49 = auStack_1b70;
    puVar30 = auStack_1cd0;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar11 & 0xffffffff));
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar11 & 0xffffffff));
      auStack_1de0 = (undefined1  [16])0x0;
      auStack_1dd0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1dd0[0xf] = (char)uVar11;
      lVar45 = uVar11 - 1;
      r = psVar14;
      iVar7 = secp256k1_keypair_create
                        (psVar14,(secp256k1_keypair *)(auStack_1590 + uVar11 * 0x60),auStack_1de0);
      if (iVar7 == 0) goto LAB_00113edc;
      r = psVar14;
      iVar7 = secp256k1_ec_pubkey_create
                        (psVar14,(secp256k1_pubkey *)(auStack_1b30 + lVar45 * 0x40),auStack_1de0);
      if (iVar7 == 0) goto LAB_00113ee1;
      psVar52 = (secp256k1_xonly_pubkey *)(auStack_1830 + lVar45 * 0x40);
      pk_parity = (uint *)(auStack_1e20 + lVar45 * 4);
      r = psVar14;
      iVar7 = secp256k1_keypair_xonly_pub
                        (psVar14,psVar52,(int *)pk_parity,
                         (secp256k1_keypair *)(auStack_1590 + uVar11 * 0x60));
      if (iVar7 == 0) goto LAB_00113ee6;
      puVar51 = auStack_1cd0 + lVar45 * 0x20;
      r = psVar14;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar14,puVar51,psVar52);
      if (iVar7 == 0) goto LAB_00113eeb;
      r = psVar14;
      iVar7 = secp256k1_xonly_pubkey_parse(psVar14,psVar52,puVar51);
      if (iVar7 == 0) goto LAB_00113ef0;
      r = psVar14;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar14,auStack_1de0,psVar52);
      if (iVar7 == 0) goto LAB_00113ef5;
      lVar26 = 0;
      do {
        if (puVar30[lVar26] != auStack_1de0[lVar26]) goto LAB_00113efa;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 0x20);
      r = psVar14;
      iVar7 = secp256k1_xonly_pubkey_from_pubkey
                        (psVar14,psVar52,(int *)&sStack_1d40,
                         (secp256k1_pubkey *)(auStack_1b30 + lVar45 * 0x40));
      if (iVar7 == 0) goto LAB_00113eff;
      if ((uint)sStack_1d40.fn != *pk_parity) goto LAB_00113f04;
      r = psVar14;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar14,auStack_1de0,psVar52);
      if (iVar7 == 0) goto LAB_00113f09;
      lVar45 = 0;
      do {
        if (puVar30[lVar45] != auStack_1de0[lVar45]) goto LAB_00113f0e;
        lVar45 = lVar45 + 1;
      } while (lVar45 != 0x20);
      r = (secp256k1_context *)auStack_1db0;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)r,puVar51);
      auStack_1db0._40_8_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)r);
      lVar45 = uVar11 * 0x68;
      iVar7 = secp256k1_fe_equal((secp256k1_fe *)r,(secp256k1_fe *)(auStack_10b0 + uVar11 * 0x68));
      if (iVar7 == 0) goto LAB_00113f13;
      auStack_1db0._0_8_ = (&uStack_1080)[uVar11 * 0xd];
      auStack_1db0._8_8_ = auStack_1078[uVar11 * 0xd];
      auStack_1db0._16_8_ = auStack_1078[uVar11 * 0xd + 1];
      auStack_1db0._24_8_ = *(undefined8 *)(auStack_1060 + lVar45 + -8);
      auStack_1db0._32_4_ = *(undefined4 *)(auStack_1060 + lVar45);
      auStack_1db0._36_4_ = *(undefined4 *)(auStack_105c + lVar45);
      auStack_1db0._44_4_ = aiStack_1058[uVar11 * 0x1a + 1];
      auStack_1db0._40_4_ = aiStack_1058[uVar11 * 0x1a];
      r = (secp256k1_context *)auStack_1db0;
      secp256k1_fe_normalize_var((secp256k1_fe *)r);
      secp256k1_fe_verify((secp256k1_fe *)r);
      if (auStack_1db0._44_4_ == 0) goto LAB_00113f18;
      if ((auStack_1db0._0_4_ & 1) != *pk_parity) goto LAB_00113f1d;
      if (6 < uVar11) {
        lVar45 = 0;
        do {
          if (puVar30[lVar45] != puVar49[lVar45]) goto LAB_00113f22;
          lVar45 = lVar45 + 1;
        } while (lVar45 != 0x20);
        if ((auStack_1db0._0_4_ & 1) != 1U - *(int *)(auStack_1e20 + (0xc - uVar11) * 4))
        goto LAB_00113f27;
      }
      uVar11 = uVar11 + 1;
      puVar30 = puVar30 + 0x20;
      puVar49 = puVar49 + -0x20;
    } while (uVar11 != 0xd);
    lVar45 = 0;
    do {
      r = psVar14;
      iVar7 = secp256k1_xonly_pubkey_parse
                        (psVar14,(secp256k1_xonly_pubkey *)(auStack_1590 + 0x60),
                         invalid_pubkey_bytes[0] + lVar45);
      if (iVar7 != 0) goto LAB_00113f2c;
      lVar45 = lVar45 + 0x20;
    } while (lVar45 != 0xe0);
    uVar23 = 1;
    puVar5 = auStack_1590;
    psVar52 = (secp256k1_xonly_pubkey *)auStack_1b30;
    puVar51 = auStack_1830;
    lVar45 = 0;
    do {
      keypair = (secp256k1_keypair *)(puVar5 + 0x60);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
      auStack_1cd0 = (undefined1  [16])0x0;
      auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1cc0[0xf] = (char)uVar23;
      r = psVar14;
      iVar7 = secp256k1_keypair_create(psVar14,keypair,auStack_1cd0);
      if (iVar7 == 0) goto LAB_00113f31;
      r = psVar14;
      iVar7 = secp256k1_keypair_xonly_pub(psVar14,psVar52,(int *)(auStack_1db0 + lVar45),keypair);
      if (iVar7 == 0) goto LAB_00113f36;
      r = psVar14;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar14,puVar51,psVar52);
      if (iVar7 == 0) goto LAB_00113f3b;
      lVar45 = lVar45 + 4;
      puVar51 = puVar51 + 0x20;
      psVar52 = psVar52 + 1;
      puVar5 = keypair->data;
      uVar23 = uVar23 + 1;
    } while (lVar45 != 0x30);
    sStack_1ce8.magic[0] = 0xda;
    sStack_1ce8.magic[1] = 'o';
    sStack_1ce8.magic[2] = 0xb3;
    sStack_1ce8.magic[3] = 0x8c;
    sStack_1ce8._4_4_ = 0;
    psStack_1e60 = (secp256k1_gej *)0x1;
    psStack_1e58 = (secp256k1_scalar *)0x0;
    do {
      iVar7 = 0xd - (int)psStack_1e60;
      if ((&iStack_1db4)[(long)psStack_1e60] == 0) {
        iVar7 = (int)psStack_1e60;
      }
      iStack_1e34 = 1;
      do {
        auStack_1e00 = (undefined1  [16])0x0;
        auStack_1e10 = (undefined1  [16])0x0;
        auStack_1e20 = (undefined1  [16])0x0;
        iStack_1df0 = 0;
        if (((ulong)num_cores == 1) ||
           (psStack_1e58 = (secp256k1_scalar *)((long)psStack_1e58 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1e58 >> 0x20 ^ (ulong)psStack_1e58 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          sStack_1ce8.noncefp = secp256k1_hardened_nonce_function_smallint;
          sStack_1ce8.ndata = &iStack_1e34;
          iVar8 = 0xd - iStack_1e34;
          if ((&iStack_1db4)[iStack_1e34] == 0) {
            iVar8 = iStack_1e34;
          }
          iVar41 = 0;
          do {
            testrand256(auStack_1de0);
            na = (code *)(auStack_1830 + ((long)psStack_1e60 + -1) * 0x20);
            secp256k1_schnorrsig_challenge
                      (&uStack_1d5c,auStack_1850 + (long)iStack_1e34 * 0x20,auStack_1de0,0x20,
                       (uchar *)(auStack_1830 + ((long)psStack_1e60 + -1) * 0x20));
            uVar11 = (ulong)uStack_1d5c;
            if (*(int *)(auStack_1e20 + uVar11 * 4) == 0) {
              uVar23 = uStack_1d5c * iVar7 + iVar8;
              uVar23 = uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
              sStack_1d40.fn = (_func_void_char_ptr_void_ptr *)0x0;
              sStack_1d40.data = (void *)0x0;
              sStack_1d30._0_15_ = SUB1615((undefined1  [16])0x0,0);
              sStack_1d30.data._7_1_ = (char)uVar23;
              r = psVar14;
              na = (code *)(auStack_1590 + (long)psStack_1e60 * 0x60);
              iVar10 = secp256k1_schnorrsig_sign_custom
                                 (psVar14,auStack_1cd0,auStack_1de0,0x20,
                                  (secp256k1_keypair *)(auStack_1590 + (long)psStack_1e60 * 0x60),
                                  &sStack_1ce8);
              if (iVar10 == 0) goto LAB_00113f40;
              lVar45 = 0;
              do {
                if (auStack_1cd0[lVar45] != auStack_1850[lVar45 + (long)iStack_1e34 * 0x20])
                goto LAB_00113f45;
                lVar45 = lVar45 + 1;
              } while (lVar45 != 0x20);
              lVar45 = 0;
              do {
                if (auStack_1cb0[lVar45] != *(char *)((long)&sStack_1d40.fn + lVar45))
                goto LAB_00113f4a;
                lVar45 = lVar45 + 1;
              } while (lVar45 != 0x20);
              *(undefined4 *)(auStack_1e20 + uVar11 * 4) = 1;
              iVar41 = iVar41 + 1;
            }
          } while (iVar41 < 0xd);
        }
        iVar8 = iStack_1e34 + 1;
        bVar53 = iStack_1e34 < 0xc;
        iStack_1e34 = iVar8;
      } while (bVar53);
      psStack_1e60 = (secp256k1_gej *)((long)psStack_1e60 + 1);
    } while (psStack_1e60 != (secp256k1_gej *)0xd);
    psStack_1e60 = (secp256k1_gej *)0x1;
    psStack_1e58 = (secp256k1_scalar *)0x0;
    do {
      lVar45 = ((long)psStack_1e60 + -1) * 0x20;
      auStack_1dd0 = *(undefined1 (*) [16])(auStack_1820 + lVar45);
      iVar7 = 0xd - (int)psStack_1e60;
      if ((&iStack_1db4)[(long)psStack_1e60] == 0) {
        iVar7 = (int)psStack_1e60;
      }
      psStack_1e30 = (secp256k1_gej *)CONCAT44(psStack_1e30._4_4_,iVar7);
      auStack_1de0._8_8_ = *(undefined8 *)(auStack_1830 + lVar45 + 8);
      auStack_1de0._0_8_ = *(undefined8 *)(auStack_1830 + lVar45);
      psStack_1e68 = (secp256k1_gej *)(auStack_1b30 + ((long)psStack_1e60 + -1) * 0x40);
      uVar11 = 1;
      do {
        auStack_1e00 = (undefined1  [16])0x0;
        auStack_1e10 = (undefined1  [16])0x0;
        auStack_1e20 = (undefined1  [16])0x0;
        iStack_1df0 = 0;
        if (((ulong)num_cores == 1) ||
           (psStack_1e58 = (secp256k1_scalar *)((long)psStack_1e58 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1e58 >> 0x20 ^ (ulong)psStack_1e58 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          if (uVar11 < 7) {
            lVar45 = (uVar11 - 1) * 0x20;
            auStack_1cc0 = *(undefined1 (*) [16])(auStack_1820 + lVar45);
            auStack_1cd0._8_8_ = *(undefined8 *)(auStack_1830 + lVar45 + 8);
            auStack_1cd0._0_8_ = *(undefined8 *)(auStack_1830 + lVar45);
            iVar7 = 0xd - (int)uVar11;
            if ((&iStack_1db4)[uVar11] == 0) {
              iVar7 = (int)uVar11;
            }
          }
          else {
            auStack_1cd0 = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar11 * 4 + 2);
            auStack_1cc0 = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar11 * 4 + 4);
            iVar7 = -1;
          }
          sStack_1e28 = CONCAT44(sStack_1e28._4_4_,(uint)(iVar7 != -1));
          iVar8 = 0;
          do {
            testrand256((uchar *)&sStack_1d40);
            na = (code *)auStack_1de0;
            secp256k1_schnorrsig_challenge
                      ((secp256k1_scalar *)&sStack_1ce8,auStack_1cd0,(uchar *)&sStack_1d40,0x20,
                       (uchar *)na);
            uVar21 = sStack_1ce8._0_8_ & 0xffffffff;
            if (*(int *)(auStack_1e20 + uVar21 * 4) == 0) {
              uVar23 = sStack_1ce8.magic * (int)psStack_1e30 + iVar7;
              iVar10 = 0;
              iVar41 = 0;
              do {
                if (iVar10 == 0xe) {
                  testrand256(auStack_1cb0);
                  uVar18 = 0;
                }
                else {
                  auStack_1cb0 = (undefined1  [16])0x0;
                  auStack_1ca0._0_15_ = SUB1615((undefined1  [16])0x0,0);
                  auStack_1ca0[0xf] = (char)iVar10;
                  uVar18 = 0;
                  if (iVar10 != 0xd && iVar7 != -1) {
                    uVar18 = (uint)(uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc) == iVar10);
                  }
                }
                r = psVar14;
                na = (code *)psStack_1e68;
                uVar19 = secp256k1_schnorrsig_verify
                                   (psVar14,auStack_1cd0,(uchar *)&sStack_1d40,0x20,
                                    (secp256k1_xonly_pubkey *)psStack_1e68);
                if (uVar19 != uVar18) goto LAB_00113f4f;
                iVar41 = iVar41 + uVar18;
                iVar10 = iVar10 + 1;
              } while (iVar10 != 0xf);
              if (iVar41 != (int)sStack_1e28) goto LAB_00113f54;
              *(undefined4 *)(auStack_1e20 + uVar21 * 4) = 1;
              iVar8 = iVar8 + 1;
            }
          } while (iVar8 < 0xd);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0xe);
      psStack_1e60 = (secp256k1_gej *)((long)psStack_1e60 + 1);
    } while (psStack_1e60 != (secp256k1_gej *)0x7);
    lVar45 = 0x68;
    uVar23 = 1;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar23);
      auStack_1cd0 = (undefined1  [16])0x0;
      auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1cc0[0xf] = (char)uVar23;
      r = psVar14;
      iVar7 = secp256k1_ellswift_create(psVar14,auStack_1b30,auStack_1cd0,(uchar *)0x0);
      if (iVar7 == 0) goto LAB_00113f59;
      secp256k1_ellswift_decode(psVar14,(secp256k1_pubkey *)auStack_1830,auStack_1b30);
      r = (secp256k1_context *)(auStack_1590 + 0x60);
      secp256k1_pubkey_load(psVar14,(secp256k1_ge *)r,(secp256k1_pubkey *)auStack_1830);
      iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)r,(secp256k1_ge *)(auStack_10b0 + lVar45));
      if (iVar7 == 0) goto LAB_00113f5e;
      lVar45 = lVar45 + 0x68;
      uVar23 = uVar23 + 1;
    } while (lVar45 != 0x548);
    secp256k1_context_destroy(psVar14);
    iVar7 = count;
  }
LAB_00113e82:
  main_cold_69();
LAB_00113e87:
  main_cold_65();
LAB_00113e8c:
  main_cold_64();
LAB_00113e91:
  main_cold_73();
LAB_00113e96:
  main_cold_72();
LAB_00113e9b:
  main_cold_71();
LAB_00113ea0:
  main_cold_10();
LAB_00113ea5:
  main_cold_11();
LAB_00113eaa:
  main_cold_12();
LAB_00113eaf:
  main_cold_13();
LAB_00113eb4:
  main_cold_14();
LAB_00113eb9:
  main_cold_15();
LAB_00113ebe:
  main_cold_48();
LAB_00113ec3:
  main_cold_16();
LAB_00113ec8:
  main_cold_17();
LAB_00113ecd:
  main_cold_18();
LAB_00113ed2:
  main_cold_19();
LAB_00113ed7:
  main_cold_20();
LAB_00113edc:
  main_cold_47();
LAB_00113ee1:
  main_cold_46();
LAB_00113ee6:
  main_cold_45();
LAB_00113eeb:
  main_cold_44();
LAB_00113ef0:
  main_cold_43();
LAB_00113ef5:
  main_cold_42();
LAB_00113efa:
  main_cold_21();
LAB_00113eff:
  main_cold_41();
LAB_00113f04:
  main_cold_22();
LAB_00113f09:
  main_cold_40();
LAB_00113f0e:
  main_cold_23();
LAB_00113f13:
  main_cold_39();
LAB_00113f18:
  main_cold_38();
LAB_00113f1d:
  main_cold_24();
LAB_00113f22:
  main_cold_25();
LAB_00113f27:
  main_cold_26();
LAB_00113f2c:
  main_cold_27();
LAB_00113f31:
  main_cold_37();
LAB_00113f36:
  main_cold_36();
LAB_00113f3b:
  main_cold_35();
LAB_00113f40:
  main_cold_34();
LAB_00113f45:
  main_cold_28();
LAB_00113f4a:
  main_cold_29();
LAB_00113f4f:
  main_cold_30();
LAB_00113f54:
  main_cold_31();
LAB_00113f59:
  main_cold_33();
LAB_00113f5e:
  main_cold_32();
  lVar45 = 0;
  do {
    uVar38 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar31 = secp256k1_test_state[1] << 0x11;
    uVar21 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar11 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar21;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar11;
    secp256k1_test_state[3] = uVar11 << 0x2d | uVar11 >> 0x13;
    secp256k1_test_state[2] = uVar21 ^ uVar31;
    (r->ecmult_gen_ctx).ge_offset.x.n[lVar45 + -1] = uVar38;
    lVar45 = lVar45 + 1;
  } while ((int)lVar45 != 4);
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}